

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<8,16>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  byte bVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  uint uVar37;
  long lVar38;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  uint uVar39;
  bool bVar40;
  bool bVar41;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar91 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  undefined1 auVar101 [64];
  undefined1 auVar103 [64];
  undefined1 auVar105 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  int iVar110;
  float fVar111;
  undefined4 uVar112;
  vfloat4 a0;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar116 [64];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  vfloat4 a0_1;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar141;
  float fVar142;
  float fVar158;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  vfloat4 b0;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  __m128 a_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar188;
  vfloat4 b0_1;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar189;
  float fVar203;
  float fVar204;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar205;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  __m128 a;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar209 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar222 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar229;
  float fVar230;
  float fVar240;
  float fVar242;
  vfloat4 a0_2;
  undefined1 auVar231 [16];
  float fVar241;
  float fVar243;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar244;
  float fVar245;
  float fVar246;
  vfloat4 a0_3;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  vfloat4 b0_2;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  vfloat4 b0_3;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [64];
  int iVar283;
  undefined1 in_ZMM17 [64];
  undefined1 auVar284 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  undefined1 auVar288 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  bool local_765;
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  uint auStack_600 [4];
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  uint uStack_460;
  float afStack_45c [7];
  undefined1 local_440 [64];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar32;
  undefined1 auVar96 [64];
  undefined1 auVar98 [64];
  undefined1 auVar100 [64];
  undefined1 auVar102 [64];
  undefined1 auVar104 [64];
  undefined1 auVar106 [64];
  undefined1 auVar267 [32];
  
  PVar6 = prim[1];
  uVar31 = (ulong)(byte)PVar6;
  lVar36 = uVar31 * 0x25;
  fVar142 = *(float *)(prim + lVar36 + 0x12);
  auVar42 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar42 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar52 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar62 = vinsertps_avx(auVar52,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar63 = vsubps_avx(auVar42,*(undefined1 (*) [16])(prim + lVar36 + 6));
  fVar141 = fVar142 * auVar63._0_4_;
  fVar111 = fVar142 * auVar62._0_4_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar31 * 4 + 6);
  auVar74 = vpmovsxbd_avx2(auVar42);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar31 * 5 + 6);
  auVar73 = vpmovsxbd_avx2(auVar52);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar31 * 6 + 6);
  auVar75 = vpmovsxbd_avx2(auVar51);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar31 * 0xf + 6);
  auVar86 = vpmovsxbd_avx2(auVar50);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar80 = vpmovsxbd_avx2(auVar58);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87 = vcvtdq2ps_avx(auVar80);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar31 + 6);
  auVar76 = vpmovsxbd_avx2(auVar55);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar31 * 0x1a + 6);
  auVar77 = vpmovsxbd_avx2(auVar56);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar31 * 0x1b + 6);
  auVar78 = vpmovsxbd_avx2(auVar57);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar31 * 0x1c + 6);
  auVar72 = vpmovsxbd_avx2(auVar61);
  auVar79 = vcvtdq2ps_avx(auVar72);
  auVar89._4_4_ = fVar111;
  auVar89._0_4_ = fVar111;
  auVar89._8_4_ = fVar111;
  auVar89._12_4_ = fVar111;
  auVar89._16_4_ = fVar111;
  auVar89._20_4_ = fVar111;
  auVar89._24_4_ = fVar111;
  auVar89._28_4_ = fVar111;
  auVar279._8_4_ = 1;
  auVar279._0_8_ = 0x100000001;
  auVar279._12_4_ = 1;
  auVar279._16_4_ = 1;
  auVar279._20_4_ = 1;
  auVar279._24_4_ = 1;
  auVar279._28_4_ = 1;
  auVar70 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar82 = ZEXT1632(CONCAT412(fVar142 * auVar62._12_4_,
                               CONCAT48(fVar142 * auVar62._8_4_,
                                        CONCAT44(fVar142 * auVar62._4_4_,fVar111))));
  auVar81 = vpermps_avx2(auVar279,auVar82);
  auVar71 = vpermps_avx512vl(auVar70,auVar82);
  fVar230 = auVar71._0_4_;
  fVar246 = auVar71._4_4_;
  auVar82._4_4_ = fVar246 * auVar75._4_4_;
  auVar82._0_4_ = fVar230 * auVar75._0_4_;
  fVar241 = auVar71._8_4_;
  auVar82._8_4_ = fVar241 * auVar75._8_4_;
  fVar242 = auVar71._12_4_;
  auVar82._12_4_ = fVar242 * auVar75._12_4_;
  fVar117 = auVar71._16_4_;
  auVar82._16_4_ = fVar117 * auVar75._16_4_;
  fVar118 = auVar71._20_4_;
  auVar82._20_4_ = fVar118 * auVar75._20_4_;
  fVar119 = auVar71._24_4_;
  auVar82._24_4_ = fVar119 * auVar75._24_4_;
  auVar82._28_4_ = auVar80._28_4_;
  auVar80._4_4_ = auVar76._4_4_ * fVar246;
  auVar80._0_4_ = auVar76._0_4_ * fVar230;
  auVar80._8_4_ = auVar76._8_4_ * fVar241;
  auVar80._12_4_ = auVar76._12_4_ * fVar242;
  auVar80._16_4_ = auVar76._16_4_ * fVar117;
  auVar80._20_4_ = auVar76._20_4_ * fVar118;
  auVar80._24_4_ = auVar76._24_4_ * fVar119;
  auVar80._28_4_ = auVar72._28_4_;
  auVar72._4_4_ = auVar79._4_4_ * fVar246;
  auVar72._0_4_ = auVar79._0_4_ * fVar230;
  auVar72._8_4_ = auVar79._8_4_ * fVar241;
  auVar72._12_4_ = auVar79._12_4_ * fVar242;
  auVar72._16_4_ = auVar79._16_4_ * fVar117;
  auVar72._20_4_ = auVar79._20_4_ * fVar118;
  auVar72._24_4_ = auVar79._24_4_ * fVar119;
  auVar72._28_4_ = auVar71._28_4_;
  auVar42 = vfmadd231ps_fma(auVar82,auVar81,auVar73);
  auVar52 = vfmadd231ps_fma(auVar80,auVar81,auVar87);
  auVar51 = vfmadd231ps_fma(auVar72,auVar78,auVar81);
  auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar89,auVar74);
  auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar89,auVar86);
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar77,auVar89);
  auVar275._4_4_ = fVar141;
  auVar275._0_4_ = fVar141;
  auVar275._8_4_ = fVar141;
  auVar275._12_4_ = fVar141;
  auVar275._16_4_ = fVar141;
  auVar275._20_4_ = fVar141;
  auVar275._24_4_ = fVar141;
  auVar275._28_4_ = fVar141;
  auVar72 = ZEXT1632(CONCAT412(fVar142 * auVar63._12_4_,
                               CONCAT48(fVar142 * auVar63._8_4_,
                                        CONCAT44(fVar142 * auVar63._4_4_,fVar141))));
  auVar80 = vpermps_avx2(auVar279,auVar72);
  auVar72 = vpermps_avx512vl(auVar70,auVar72);
  fVar142 = auVar72._0_4_;
  fVar230 = auVar72._4_4_;
  auVar81._4_4_ = fVar230 * auVar75._4_4_;
  auVar81._0_4_ = fVar142 * auVar75._0_4_;
  fVar246 = auVar72._8_4_;
  auVar81._8_4_ = fVar246 * auVar75._8_4_;
  fVar241 = auVar72._12_4_;
  auVar81._12_4_ = fVar241 * auVar75._12_4_;
  fVar242 = auVar72._16_4_;
  auVar81._16_4_ = fVar242 * auVar75._16_4_;
  fVar117 = auVar72._20_4_;
  auVar81._20_4_ = fVar117 * auVar75._20_4_;
  fVar118 = auVar72._24_4_;
  auVar81._24_4_ = fVar118 * auVar75._24_4_;
  auVar81._28_4_ = fVar111;
  auVar70._4_4_ = auVar76._4_4_ * fVar230;
  auVar70._0_4_ = auVar76._0_4_ * fVar142;
  auVar70._8_4_ = auVar76._8_4_ * fVar246;
  auVar70._12_4_ = auVar76._12_4_ * fVar241;
  auVar70._16_4_ = auVar76._16_4_ * fVar242;
  auVar70._20_4_ = auVar76._20_4_ * fVar117;
  auVar70._24_4_ = auVar76._24_4_ * fVar118;
  auVar70._28_4_ = auVar75._28_4_;
  auVar76._4_4_ = auVar79._4_4_ * fVar230;
  auVar76._0_4_ = auVar79._0_4_ * fVar142;
  auVar76._8_4_ = auVar79._8_4_ * fVar246;
  auVar76._12_4_ = auVar79._12_4_ * fVar241;
  auVar76._16_4_ = auVar79._16_4_ * fVar242;
  auVar76._20_4_ = auVar79._20_4_ * fVar117;
  auVar76._24_4_ = auVar79._24_4_ * fVar118;
  auVar76._28_4_ = auVar72._28_4_;
  auVar50 = vfmadd231ps_fma(auVar81,auVar80,auVar73);
  auVar58 = vfmadd231ps_fma(auVar70,auVar80,auVar87);
  auVar55 = vfmadd231ps_fma(auVar76,auVar80,auVar78);
  auVar62 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar275,auVar74);
  auVar63 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar275,auVar86);
  auVar90._8_4_ = 0x7fffffff;
  auVar90._0_8_ = 0x7fffffff7fffffff;
  auVar90._12_4_ = 0x7fffffff;
  auVar90._16_4_ = 0x7fffffff;
  auVar90._20_4_ = 0x7fffffff;
  auVar90._24_4_ = 0x7fffffff;
  auVar90._28_4_ = 0x7fffffff;
  auVar64 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar275,auVar77);
  auVar74 = vandps_avx(ZEXT1632(auVar42),auVar90);
  auVar217._8_4_ = 0x219392ef;
  auVar217._0_8_ = 0x219392ef219392ef;
  auVar217._12_4_ = 0x219392ef;
  auVar217._16_4_ = 0x219392ef;
  auVar217._20_4_ = 0x219392ef;
  auVar217._24_4_ = 0x219392ef;
  auVar217._28_4_ = 0x219392ef;
  uVar34 = vcmpps_avx512vl(auVar74,auVar217,1);
  bVar40 = (bool)((byte)uVar34 & 1);
  auVar71._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar42._0_4_;
  bVar40 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar42._4_4_;
  bVar40 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar42._8_4_;
  bVar40 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar42._12_4_;
  auVar71._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * 0x219392ef;
  auVar71._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * 0x219392ef;
  auVar71._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * 0x219392ef;
  auVar71._28_4_ = (uint)(byte)(uVar34 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar52),auVar90);
  uVar34 = vcmpps_avx512vl(auVar74,auVar217,1);
  bVar40 = (bool)((byte)uVar34 & 1);
  auVar83._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar52._0_4_;
  bVar40 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar52._4_4_;
  bVar40 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar52._8_4_;
  bVar40 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar52._12_4_;
  auVar83._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * 0x219392ef;
  auVar83._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * 0x219392ef;
  auVar83._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * 0x219392ef;
  auVar83._28_4_ = (uint)(byte)(uVar34 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar51),auVar90);
  uVar34 = vcmpps_avx512vl(auVar74,auVar217,1);
  bVar40 = (bool)((byte)uVar34 & 1);
  auVar74._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar51._0_4_;
  bVar40 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar51._4_4_;
  bVar40 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar51._8_4_;
  bVar40 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar51._12_4_;
  auVar74._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * 0x219392ef;
  auVar74._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * 0x219392ef;
  auVar74._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * 0x219392ef;
  auVar74._28_4_ = (uint)(byte)(uVar34 >> 7) * 0x219392ef;
  auVar73 = vrcp14ps_avx512vl(auVar71);
  auVar164._8_4_ = 0x3f800000;
  auVar164._0_8_ = &DAT_3f8000003f800000;
  auVar164._12_4_ = 0x3f800000;
  auVar164._16_4_ = 0x3f800000;
  auVar164._20_4_ = 0x3f800000;
  auVar164._24_4_ = 0x3f800000;
  auVar164._28_4_ = 0x3f800000;
  auVar42 = vfnmadd213ps_fma(auVar71,auVar73,auVar164);
  auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar83);
  auVar52 = vfnmadd213ps_fma(auVar83,auVar73,auVar164);
  auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar74);
  auVar51 = vfnmadd213ps_fma(auVar74,auVar73,auVar164);
  auVar51 = vfmadd132ps_fma(ZEXT1632(auVar51),auVar73,auVar73);
  fVar142 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar36 + 0x16)) *
            *(float *)(prim + lVar36 + 0x1a);
  auVar155._4_4_ = fVar142;
  auVar155._0_4_ = fVar142;
  auVar155._8_4_ = fVar142;
  auVar155._12_4_ = fVar142;
  auVar155._16_4_ = fVar142;
  auVar155._20_4_ = fVar142;
  auVar155._24_4_ = fVar142;
  auVar155._28_4_ = fVar142;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 7 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0xb + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 9 + 6));
  auVar50 = vfmadd213ps_fma(auVar73,auVar155,auVar74);
  auVar74 = vcvtdq2ps_avx(auVar75);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0xd + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar58 = vfmadd213ps_fma(auVar73,auVar155,auVar74);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0x12 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  uVar34 = (ulong)(uint)((int)(uVar31 * 5) << 2);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 2 + uVar34 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar55 = vfmadd213ps_fma(auVar73,auVar155,auVar74);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar34 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0x18 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar56 = vfmadd213ps_fma(auVar73,auVar155,auVar74);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0x1d + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 + (ulong)(byte)PVar6 * 0x20 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar57 = vfmadd213ps_fma(auVar73,auVar155,auVar74);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar6 * 0x20 - uVar31) + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0x23 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar61 = vfmadd213ps_fma(auVar73,auVar155,auVar74);
  auVar74 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar62));
  auVar77._4_4_ = auVar42._4_4_ * auVar74._4_4_;
  auVar77._0_4_ = auVar42._0_4_ * auVar74._0_4_;
  auVar77._8_4_ = auVar42._8_4_ * auVar74._8_4_;
  auVar77._12_4_ = auVar42._12_4_ * auVar74._12_4_;
  auVar77._16_4_ = auVar74._16_4_ * 0.0;
  auVar77._20_4_ = auVar74._20_4_ * 0.0;
  auVar77._24_4_ = auVar74._24_4_ * 0.0;
  auVar77._28_4_ = auVar74._28_4_;
  auVar74 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar62));
  auVar88._0_4_ = auVar42._0_4_ * auVar74._0_4_;
  auVar88._4_4_ = auVar42._4_4_ * auVar74._4_4_;
  auVar88._8_4_ = auVar42._8_4_ * auVar74._8_4_;
  auVar88._12_4_ = auVar42._12_4_ * auVar74._12_4_;
  auVar88._16_4_ = auVar74._16_4_ * 0.0;
  auVar88._20_4_ = auVar74._20_4_ * 0.0;
  auVar88._24_4_ = auVar74._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar74 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar63));
  auVar78._4_4_ = auVar52._4_4_ * auVar74._4_4_;
  auVar78._0_4_ = auVar52._0_4_ * auVar74._0_4_;
  auVar78._8_4_ = auVar52._8_4_ * auVar74._8_4_;
  auVar78._12_4_ = auVar52._12_4_ * auVar74._12_4_;
  auVar78._16_4_ = auVar74._16_4_ * 0.0;
  auVar78._20_4_ = auVar74._20_4_ * 0.0;
  auVar78._24_4_ = auVar74._24_4_ * 0.0;
  auVar78._28_4_ = auVar74._28_4_;
  auVar74 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar63));
  auVar85._0_4_ = auVar52._0_4_ * auVar74._0_4_;
  auVar85._4_4_ = auVar52._4_4_ * auVar74._4_4_;
  auVar85._8_4_ = auVar52._8_4_ * auVar74._8_4_;
  auVar85._12_4_ = auVar52._12_4_ * auVar74._12_4_;
  auVar85._16_4_ = auVar74._16_4_ * 0.0;
  auVar85._20_4_ = auVar74._20_4_ * 0.0;
  auVar85._24_4_ = auVar74._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar74 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar64));
  auVar79._4_4_ = auVar51._4_4_ * auVar74._4_4_;
  auVar79._0_4_ = auVar51._0_4_ * auVar74._0_4_;
  auVar79._8_4_ = auVar51._8_4_ * auVar74._8_4_;
  auVar79._12_4_ = auVar51._12_4_ * auVar74._12_4_;
  auVar79._16_4_ = auVar74._16_4_ * 0.0;
  auVar79._20_4_ = auVar74._20_4_ * 0.0;
  auVar79._24_4_ = auVar74._24_4_ * 0.0;
  auVar79._28_4_ = auVar74._28_4_;
  auVar74 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar64));
  auVar84._0_4_ = auVar51._0_4_ * auVar74._0_4_;
  auVar84._4_4_ = auVar51._4_4_ * auVar74._4_4_;
  auVar84._8_4_ = auVar51._8_4_ * auVar74._8_4_;
  auVar84._12_4_ = auVar51._12_4_ * auVar74._12_4_;
  auVar84._16_4_ = auVar74._16_4_ * 0.0;
  auVar84._20_4_ = auVar74._20_4_ * 0.0;
  auVar84._24_4_ = auVar74._24_4_ * 0.0;
  auVar84._28_4_ = 0;
  auVar74 = vpminsd_avx2(auVar77,auVar88);
  auVar73 = vpminsd_avx2(auVar78,auVar85);
  auVar74 = vmaxps_avx(auVar74,auVar73);
  auVar73 = vpminsd_avx2(auVar79,auVar84);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar75._4_4_ = uVar112;
  auVar75._0_4_ = uVar112;
  auVar75._8_4_ = uVar112;
  auVar75._12_4_ = uVar112;
  auVar75._16_4_ = uVar112;
  auVar75._20_4_ = uVar112;
  auVar75._24_4_ = uVar112;
  auVar75._28_4_ = uVar112;
  auVar73 = vmaxps_avx512vl(auVar73,auVar75);
  auVar74 = vmaxps_avx(auVar74,auVar73);
  auVar73._8_4_ = 0x3f7ffffa;
  auVar73._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar73._12_4_ = 0x3f7ffffa;
  auVar73._16_4_ = 0x3f7ffffa;
  auVar73._20_4_ = 0x3f7ffffa;
  auVar73._24_4_ = 0x3f7ffffa;
  auVar73._28_4_ = 0x3f7ffffa;
  local_400 = vmulps_avx512vl(auVar74,auVar73);
  auVar74 = vpmaxsd_avx2(auVar77,auVar88);
  auVar73 = vpmaxsd_avx2(auVar78,auVar85);
  auVar74 = vminps_avx(auVar74,auVar73);
  auVar73 = vpmaxsd_avx2(auVar79,auVar84);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar86._4_4_ = uVar112;
  auVar86._0_4_ = uVar112;
  auVar86._8_4_ = uVar112;
  auVar86._12_4_ = uVar112;
  auVar86._16_4_ = uVar112;
  auVar86._20_4_ = uVar112;
  auVar86._24_4_ = uVar112;
  auVar86._28_4_ = uVar112;
  auVar73 = vminps_avx512vl(auVar73,auVar86);
  auVar74 = vminps_avx(auVar74,auVar73);
  auVar87._8_4_ = 0x3f800003;
  auVar87._0_8_ = 0x3f8000033f800003;
  auVar87._12_4_ = 0x3f800003;
  auVar87._16_4_ = 0x3f800003;
  auVar87._20_4_ = 0x3f800003;
  auVar87._24_4_ = 0x3f800003;
  auVar87._28_4_ = 0x3f800003;
  auVar74 = vmulps_avx512vl(auVar74,auVar87);
  auVar73 = vpbroadcastd_avx512vl();
  uVar17 = vpcmpgtd_avx512vl(auVar73,_DAT_0205a920);
  uVar15 = vcmpps_avx512vl(local_400,auVar74,2);
  bVar40 = (byte)((byte)uVar15 & (byte)uVar17) == 0;
  local_765 = !bVar40;
  if (bVar40) {
    return local_765;
  }
  uVar34 = (ulong)(byte)((byte)uVar15 & (byte)uVar17);
  auVar116 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar116);
  auVar42 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar116 = ZEXT1664(auVar42);
LAB_01ec8468:
  lVar36 = 0;
  for (uVar31 = uVar34; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
    lVar36 = lVar36 + 1;
  }
  uVar39 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar39].ptr;
  fVar142 = (pGVar8->time_range).lower;
  fVar142 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar142) / ((pGVar8->time_range).upper - fVar142));
  auVar42 = vroundss_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142),9);
  auVar42 = vminss_avx(auVar42,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar43 = vmaxss_avx512f(auVar116._0_16_,auVar42);
  uVar31 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar36 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar38 = (long)(int)auVar43._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar38);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar38);
  auVar42 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar31);
  lVar36 = uVar31 + 1;
  auVar52 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar36);
  lVar1 = uVar31 + 2;
  auVar51 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar31 + 3;
  auVar50 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar38);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar38);
  auVar58 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar31);
  auVar55 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar36);
  auVar56 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar57 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar38);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar38);
  auVar61 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar31);
  auVar62 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar36);
  auVar63 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar64 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  auVar116 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar116);
  lVar11 = *(long *)(lVar10 + 0x38 + lVar38);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar38);
  auVar65 = *(undefined1 (*) [16])(lVar11 + uVar31 * lVar10);
  auVar66 = *(undefined1 (*) [16])(lVar11 + lVar36 * lVar10);
  auVar121 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar10);
  auVar44 = vsubss_avx512f(ZEXT416((uint)fVar142),auVar43);
  auVar116._0_16_ = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar45 = vmulps_avx512vl(auVar50,auVar116._0_16_);
  auVar120._8_4_ = 0x3e2aaaab;
  auVar120._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar120._12_4_ = 0x3e2aaaab;
  auVar43 = vfmadd213ps_avx512vl(auVar120,auVar51,auVar45);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar52,auVar46);
  auVar47 = vfmadd231ps_avx512vl(auVar43,auVar42,auVar120);
  auVar43._8_4_ = 0x3f000000;
  auVar43._0_8_ = 0x3f0000003f000000;
  auVar43._12_4_ = 0x3f000000;
  auVar43 = vfmadd231ps_avx512vl(auVar45,auVar51,auVar43);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar52,auVar116._0_16_);
  auVar45._8_4_ = 0x3f000000;
  auVar45._0_8_ = 0x3f0000003f000000;
  auVar45._12_4_ = 0x3f000000;
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar42,auVar45);
  auVar45 = vmulps_avx512vl(auVar57,auVar116._0_16_);
  auVar48 = vfmadd213ps_avx512vl(auVar120,auVar56,auVar45);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar55,auVar46);
  auVar49 = vfmadd231ps_avx512vl(auVar48,auVar58,auVar120);
  auVar48._8_4_ = 0x3f000000;
  auVar48._0_8_ = 0x3f0000003f000000;
  auVar48._12_4_ = 0x3f000000;
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar56,auVar48);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar55,auVar116._0_16_);
  auVar53._8_4_ = 0x3f000000;
  auVar53._0_8_ = 0x3f0000003f000000;
  auVar53._12_4_ = 0x3f000000;
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar58,auVar53);
  auVar48 = vmulps_avx512vl(auVar50,auVar120);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar51,auVar46);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar52,auVar120);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar42,auVar116._0_16_);
  auVar54._8_4_ = 0x3f000000;
  auVar54._0_8_ = 0x3f0000003f000000;
  auVar54._12_4_ = 0x3f000000;
  auVar50 = vmulps_avx512vl(auVar50,auVar54);
  auVar51 = vfmadd231ps_avx512vl(auVar50,auVar116._0_16_,auVar51);
  auVar59._8_4_ = 0x3f000000;
  auVar59._0_8_ = 0x3f0000003f000000;
  auVar59._12_4_ = 0x3f000000;
  auVar52 = vfnmadd231ps_avx512vl(auVar51,auVar52,auVar59);
  auVar53 = vfnmadd231ps_avx512vl(auVar52,auVar116._0_16_,auVar42);
  auVar113._0_4_ = auVar57._0_4_ * 0.16666667;
  auVar113._4_4_ = auVar57._4_4_ * 0.16666667;
  auVar113._8_4_ = auVar57._8_4_ * 0.16666667;
  auVar113._12_4_ = auVar57._12_4_ * 0.16666667;
  auVar42 = vfmadd231ps_avx512vl(auVar113,auVar56,auVar46);
  auVar42 = vfmadd231ps_fma(auVar42,auVar55,auVar120);
  auVar54 = vfmadd231ps_avx512vl(auVar42,auVar58,auVar116._0_16_);
  auVar60._8_4_ = 0x3f000000;
  auVar60._0_8_ = 0x3f0000003f000000;
  auVar60._12_4_ = 0x3f000000;
  auVar42 = vmulps_avx512vl(auVar57,auVar60);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar116._0_16_,auVar56);
  auVar67._8_4_ = 0x3f000000;
  auVar67._0_8_ = 0x3f0000003f000000;
  auVar67._12_4_ = 0x3f000000;
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar55,auVar67);
  auVar55 = vfnmadd231ps_avx512vl(auVar42,auVar116._0_16_,auVar58);
  auVar42 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar52 = vshufps_avx512vl(auVar49,auVar49,0xc9);
  fVar118 = auVar43._0_4_;
  auVar166._0_4_ = fVar118 * auVar52._0_4_;
  fVar119 = auVar43._4_4_;
  auVar166._4_4_ = fVar119 * auVar52._4_4_;
  fVar141 = auVar43._8_4_;
  auVar166._8_4_ = fVar141 * auVar52._8_4_;
  fVar158 = auVar43._12_4_;
  auVar166._12_4_ = fVar158 * auVar52._12_4_;
  auVar52 = vfmsub231ps_avx512vl(auVar166,auVar42,auVar49);
  auVar51 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar52 = vshufps_avx512vl(auVar45,auVar45,0xc9);
  auVar178._0_4_ = fVar118 * auVar52._0_4_;
  auVar178._4_4_ = fVar119 * auVar52._4_4_;
  auVar178._8_4_ = fVar141 * auVar52._8_4_;
  auVar178._12_4_ = fVar158 * auVar52._12_4_;
  auVar42 = vfmsub231ps_avx512vl(auVar178,auVar42,auVar45);
  auVar50 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar52 = vshufps_avx(auVar54,auVar54,0xc9);
  fVar111 = auVar53._0_4_;
  auVar206._0_4_ = auVar52._0_4_ * fVar111;
  fVar230 = auVar53._4_4_;
  auVar206._4_4_ = auVar52._4_4_ * fVar230;
  fVar246 = auVar53._8_4_;
  auVar206._8_4_ = auVar52._8_4_ * fVar246;
  fVar241 = auVar53._12_4_;
  auVar206._12_4_ = auVar52._12_4_ * fVar241;
  auVar52 = vfmsub231ps_fma(auVar206,auVar42,auVar54);
  auVar58 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar52 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar207._0_4_ = auVar52._0_4_ * fVar111;
  auVar207._4_4_ = auVar52._4_4_ * fVar230;
  auVar207._8_4_ = auVar52._8_4_ * fVar246;
  auVar207._12_4_ = auVar52._12_4_ * fVar241;
  auVar42 = vfmsub231ps_fma(auVar207,auVar42,auVar55);
  auVar55 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vdpps_avx(auVar51,auVar51,0x7f);
  auVar282._4_60_ = auVar116._4_60_;
  auVar282._0_4_ = auVar42._0_4_;
  auVar52 = vrsqrt14ss_avx512f(auVar116._0_16_,auVar282._0_16_);
  auVar56 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar57 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
  auVar57 = vmulss_avx512f(auVar57,auVar52);
  auVar52 = vmulss_avx512f(auVar57,ZEXT416((uint)(auVar52._0_4_ * auVar52._0_4_)));
  auVar52 = vaddss_avx512f(auVar56,auVar52);
  auVar219._0_4_ = auVar52._0_4_;
  auVar219._4_4_ = auVar219._0_4_;
  auVar219._8_4_ = auVar219._0_4_;
  auVar219._12_4_ = auVar219._0_4_;
  auVar56 = vmulps_avx512vl(auVar51,auVar219);
  auVar52 = vdpps_avx(auVar51,auVar50,0x7f);
  auVar57 = vbroadcastss_avx512vl(auVar42);
  auVar50 = vmulps_avx512vl(auVar57,auVar50);
  fVar142 = auVar52._0_4_;
  auVar167._0_4_ = fVar142 * auVar51._0_4_;
  auVar167._4_4_ = fVar142 * auVar51._4_4_;
  auVar167._8_4_ = fVar142 * auVar51._8_4_;
  auVar167._12_4_ = fVar142 * auVar51._12_4_;
  auVar51 = vsubps_avx(auVar50,auVar167);
  auVar52 = vrcp14ss_avx512f(auVar116._0_16_,auVar282._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar52,ZEXT416(0x40000000));
  fVar242 = auVar52._0_4_ * auVar42._0_4_;
  auVar42 = vdpps_avx(auVar58,auVar58,0x7f);
  auVar287._16_48_ = auVar116._16_48_;
  auVar287._0_16_ = auVar116._0_16_;
  auVar286._4_60_ = auVar287._4_60_;
  auVar286._0_4_ = auVar42._0_4_;
  auVar52 = vrsqrt14ss_avx512f(auVar116._0_16_,auVar286._0_16_);
  auVar50 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar57 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
  fVar142 = auVar52._0_4_;
  fVar142 = auVar50._0_4_ + auVar57._0_4_ * fVar142 * fVar142 * fVar142;
  auVar220._0_4_ = fVar142 * auVar58._0_4_;
  auVar220._4_4_ = fVar142 * auVar58._4_4_;
  auVar220._8_4_ = fVar142 * auVar58._8_4_;
  auVar220._12_4_ = fVar142 * auVar58._12_4_;
  auVar52 = vdpps_avx(auVar58,auVar55,0x7f);
  auVar50 = vbroadcastss_avx512vl(auVar42);
  auVar50 = vmulps_avx512vl(auVar50,auVar55);
  fVar117 = auVar52._0_4_;
  auVar114._0_4_ = fVar117 * auVar58._0_4_;
  auVar114._4_4_ = fVar117 * auVar58._4_4_;
  auVar114._8_4_ = fVar117 * auVar58._8_4_;
  auVar114._12_4_ = fVar117 * auVar58._12_4_;
  auVar52 = vsubps_avx(auVar50,auVar114);
  auVar50 = vrcp14ss_avx512f(auVar116._0_16_,auVar286._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar50,ZEXT416(0x40000000));
  fVar117 = auVar50._0_4_ * auVar42._0_4_;
  auVar50 = vshufps_avx512vl(auVar47,auVar47,0xff);
  auVar58 = vmulps_avx512vl(auVar50,auVar56);
  auVar55 = vsubps_avx512vl(auVar47,auVar58);
  auVar42 = vshufps_avx(auVar43,auVar43,0xff);
  auVar42 = vmulps_avx512vl(auVar42,auVar56);
  auVar159._0_4_ = auVar42._0_4_ + auVar50._0_4_ * auVar219._0_4_ * fVar242 * auVar51._0_4_;
  auVar159._4_4_ = auVar42._4_4_ + auVar50._4_4_ * auVar219._0_4_ * fVar242 * auVar51._4_4_;
  auVar159._8_4_ = auVar42._8_4_ + auVar50._8_4_ * auVar219._0_4_ * fVar242 * auVar51._8_4_;
  auVar159._12_4_ = auVar42._12_4_ + auVar50._12_4_ * auVar219._0_4_ * fVar242 * auVar51._12_4_;
  auVar42 = vsubps_avx(auVar43,auVar159);
  auVar56 = vaddps_avx512vl(auVar47,auVar58);
  auVar179._0_4_ = fVar118 + auVar159._0_4_;
  auVar179._4_4_ = fVar119 + auVar159._4_4_;
  auVar179._8_4_ = fVar141 + auVar159._8_4_;
  auVar179._12_4_ = fVar158 + auVar159._12_4_;
  auVar51 = vshufps_avx512vl(auVar48,auVar48,0xff);
  auVar261._0_4_ = auVar220._0_4_ * auVar51._0_4_;
  auVar261._4_4_ = auVar220._4_4_ * auVar51._4_4_;
  auVar261._8_4_ = auVar220._8_4_ * auVar51._8_4_;
  auVar261._12_4_ = auVar220._12_4_ * auVar51._12_4_;
  auVar57 = vsubps_avx512vl(auVar48,auVar261);
  auVar50 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar50 = vmulps_avx512vl(auVar50,auVar220);
  auVar168._0_4_ = auVar50._0_4_ + auVar51._0_4_ * fVar142 * auVar52._0_4_ * fVar117;
  auVar168._4_4_ = auVar50._4_4_ + auVar51._4_4_ * fVar142 * auVar52._4_4_ * fVar117;
  auVar168._8_4_ = auVar50._8_4_ + auVar51._8_4_ * fVar142 * auVar52._8_4_ * fVar117;
  auVar168._12_4_ = auVar50._12_4_ + auVar51._12_4_ * fVar142 * auVar52._12_4_ * fVar117;
  auVar52 = vsubps_avx(auVar53,auVar168);
  auVar43 = vaddps_avx512vl(auVar48,auVar261);
  auVar262._0_4_ = fVar111 + auVar168._0_4_;
  auVar262._4_4_ = fVar230 + auVar168._4_4_;
  auVar262._8_4_ = fVar246 + auVar168._8_4_;
  auVar262._12_4_ = fVar241 + auVar168._12_4_;
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar42 = vmulps_avx512vl(auVar42,auVar45);
  auVar190._0_4_ = auVar55._0_4_ + auVar42._0_4_;
  auVar190._4_4_ = auVar55._4_4_ + auVar42._4_4_;
  auVar190._8_4_ = auVar55._8_4_ + auVar42._8_4_;
  auVar190._12_4_ = auVar55._12_4_ + auVar42._12_4_;
  auVar42 = vmulps_avx512vl(auVar52,auVar45);
  auVar58 = vsubps_avx(auVar57,auVar42);
  auVar42 = vmulps_avx512vl(auVar179,auVar45);
  auVar48 = vaddps_avx512vl(auVar56,auVar42);
  auVar42 = vmulps_avx512vl(auVar262,auVar45);
  auVar53 = vsubps_avx512vl(auVar43,auVar42);
  auVar42 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  auVar52 = vmulps_avx512vl(auVar64,auVar116._0_16_);
  auVar51 = vfmadd213ps_avx512vl(auVar120,auVar63,auVar52);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar62,auVar46);
  auVar54 = vfmadd231ps_avx512vl(auVar51,auVar61,auVar120);
  auVar47._8_4_ = 0x3f000000;
  auVar47._0_8_ = 0x3f0000003f000000;
  auVar47._12_4_ = 0x3f000000;
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar63,auVar47);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar62,auVar116._0_16_);
  auVar49._8_4_ = 0x3f000000;
  auVar49._0_8_ = 0x3f0000003f000000;
  auVar49._12_4_ = 0x3f000000;
  auVar59 = vfnmadd231ps_avx512vl(auVar52,auVar61,auVar49);
  auVar52 = vmulps_avx512vl(auVar42,auVar116._0_16_);
  auVar51 = vfmadd213ps_avx512vl(auVar120,auVar121,auVar52);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar66,auVar46);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar65,auVar120);
  auVar68._8_4_ = 0x3f000000;
  auVar68._0_8_ = 0x3f0000003f000000;
  auVar68._12_4_ = 0x3f000000;
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar121,auVar68);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar66,auVar116._0_16_);
  auVar14._8_4_ = 0x3f000000;
  auVar14._0_8_ = 0x3f0000003f000000;
  auVar14._12_4_ = 0x3f000000;
  auVar50 = vfnmadd231ps_avx512vl(auVar52,auVar65,auVar14);
  auVar52 = vmulps_avx512vl(auVar64,auVar120);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar63,auVar46);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar62,auVar120);
  auVar60 = vfmadd231ps_avx512vl(auVar52,auVar61,auVar116._0_16_);
  auVar69._8_4_ = 0x3f000000;
  auVar69._0_8_ = 0x3f0000003f000000;
  auVar69._12_4_ = 0x3f000000;
  auVar52 = vmulps_avx512vl(auVar64,auVar69);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar116._0_16_,auVar63);
  auVar63._8_4_ = 0x3f000000;
  auVar63._0_8_ = 0x3f0000003f000000;
  auVar63._12_4_ = 0x3f000000;
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar62,auVar63);
  auVar61 = vfnmadd231ps_avx512vl(auVar52,auVar116._0_16_,auVar61);
  auVar52 = vmulps_avx512vl(auVar42,auVar120);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar121,auVar46);
  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar288 = ZEXT1664(auVar62);
  auVar52 = vfmadd231ps_fma(auVar52,auVar66,auVar120);
  auVar63 = vfmadd231ps_avx512vl(auVar52,auVar65,auVar116._0_16_);
  auVar42 = vmulps_avx512vl(auVar42,auVar62);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar116._0_16_,auVar121);
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar62,auVar66);
  auVar62 = vfnmadd231ps_avx512vl(auVar42,auVar116._0_16_,auVar65);
  auVar42 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar52 = vshufps_avx512vl(auVar51,auVar51,0xc9);
  fVar230 = auVar59._0_4_;
  auVar268._0_4_ = fVar230 * auVar52._0_4_;
  fVar246 = auVar59._4_4_;
  auVar268._4_4_ = fVar246 * auVar52._4_4_;
  fVar241 = auVar59._8_4_;
  auVar268._8_4_ = fVar241 * auVar52._8_4_;
  fVar242 = auVar59._12_4_;
  auVar268._12_4_ = fVar242 * auVar52._12_4_;
  auVar52 = vfmsub231ps_avx512vl(auVar268,auVar42,auVar51);
  auVar51 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar52 = vshufps_avx512vl(auVar50,auVar50,0xc9);
  auVar276._0_4_ = fVar230 * auVar52._0_4_;
  auVar276._4_4_ = fVar246 * auVar52._4_4_;
  auVar276._8_4_ = fVar241 * auVar52._8_4_;
  auVar276._12_4_ = fVar242 * auVar52._12_4_;
  auVar42 = vfmsub231ps_avx512vl(auVar276,auVar42,auVar50);
  auVar50 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar52 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar42 = vshufps_avx512vl(auVar63,auVar63,0xc9);
  auVar42 = vmulps_avx512vl(auVar61,auVar42);
  auVar42 = vfmsub231ps_avx512vl(auVar42,auVar52,auVar63);
  auVar63 = vshufps_avx512vl(auVar42,auVar42,0xc9);
  auVar64 = vshufps_avx512vl(auVar62,auVar62,0xc9);
  auVar42 = vdpps_avx(auVar51,auVar51,0x7f);
  auVar64 = vmulps_avx512vl(auVar61,auVar64);
  auVar52 = vfmsub231ps_avx512vl(auVar64,auVar52,auVar62);
  auVar62 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar285._16_48_ = auVar116._16_48_;
  auVar285._0_16_ = auVar116._0_16_;
  auVar284._4_60_ = auVar285._4_60_;
  auVar284._0_4_ = auVar42._0_4_;
  auVar52 = vrsqrt14ss_avx512f(auVar116._0_16_,auVar284._0_16_);
  auVar64 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar65 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
  auVar65 = vmulss_avx512f(auVar65,auVar52);
  auVar52 = vmulss_avx512f(auVar52,auVar52);
  auVar52 = vmulss_avx512f(auVar65,auVar52);
  auVar52 = vaddss_avx512f(auVar64,auVar52);
  auVar64 = vbroadcastss_avx512vl(auVar52);
  auVar65 = vmulps_avx512vl(auVar51,auVar64);
  auVar52 = vdpps_avx(auVar51,auVar50,0x7f);
  auVar66 = vbroadcastss_avx512vl(auVar42);
  auVar50 = vmulps_avx512vl(auVar66,auVar50);
  fVar142 = auVar52._0_4_;
  auVar169._0_4_ = auVar51._0_4_ * fVar142;
  auVar169._4_4_ = auVar51._4_4_ * fVar142;
  auVar169._8_4_ = auVar51._8_4_ * fVar142;
  auVar169._12_4_ = auVar51._12_4_ * fVar142;
  auVar52 = vsubps_avx(auVar50,auVar169);
  auVar51 = vrcp14ss_avx512f(auVar116._0_16_,auVar284._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar51,ZEXT416(0x40000000));
  fVar142 = auVar51._0_4_ * auVar42._0_4_;
  auVar42 = vdpps_avx(auVar63,auVar63,0x7f);
  auVar66._0_4_ = fVar142 * auVar52._0_4_;
  auVar66._4_4_ = fVar142 * auVar52._4_4_;
  auVar66._8_4_ = fVar142 * auVar52._8_4_;
  auVar66._12_4_ = fVar142 * auVar52._12_4_;
  auVar51 = vmulps_avx512vl(auVar64,auVar66);
  auVar91._16_48_ = auVar116._16_48_;
  auVar91._0_16_ = auVar116._0_16_;
  auVar107._4_60_ = auVar91._4_60_;
  auVar107._0_4_ = auVar42._0_4_;
  auVar52 = vrsqrt14ss_avx512f(auVar116._0_16_,auVar107._0_16_);
  auVar50 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar64 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
  auVar67 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar64 = vmulss_avx512f(auVar64,auVar52);
  auVar52 = vmulss_avx512f(auVar64,ZEXT416((uint)(auVar52._0_4_ * auVar52._0_4_)));
  fVar142 = auVar50._0_4_ + auVar52._0_4_;
  auVar277._0_4_ = auVar63._0_4_ * fVar142;
  auVar277._4_4_ = auVar63._4_4_ * fVar142;
  auVar277._8_4_ = auVar63._8_4_ * fVar142;
  auVar277._12_4_ = auVar63._12_4_ * fVar142;
  auVar52 = vdpps_avx(auVar63,auVar62,0x7f);
  auVar50 = vbroadcastss_avx512vl(auVar42);
  auVar50 = vmulps_avx512vl(auVar50,auVar62);
  fVar111 = auVar52._0_4_;
  auVar180._0_4_ = auVar63._0_4_ * fVar111;
  auVar180._4_4_ = auVar63._4_4_ * fVar111;
  auVar180._8_4_ = auVar63._8_4_ * fVar111;
  auVar180._12_4_ = auVar63._12_4_ * fVar111;
  auVar52 = vsubps_avx(auVar50,auVar180);
  auVar50 = vrcp14ss_avx512f(auVar116._0_16_,auVar107._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar50,ZEXT416(0x40000000));
  auVar286 = ZEXT464(0x3f800000);
  fVar111 = auVar42._0_4_ * auVar50._0_4_;
  auVar50 = vshufps_avx512vl(auVar54,auVar54,0xff);
  auVar62 = vmulps_avx512vl(auVar50,auVar65);
  auVar63 = vsubps_avx512vl(auVar54,auVar62);
  auVar42 = vshufps_avx(auVar59,auVar59,0xff);
  auVar42 = vmulps_avx512vl(auVar42,auVar65);
  auVar64._0_4_ = auVar42._0_4_ + auVar50._0_4_ * auVar51._0_4_;
  auVar64._4_4_ = auVar42._4_4_ + auVar50._4_4_ * auVar51._4_4_;
  auVar64._8_4_ = auVar42._8_4_ + auVar50._8_4_ * auVar51._8_4_;
  auVar64._12_4_ = auVar42._12_4_ + auVar50._12_4_ * auVar51._12_4_;
  auVar42 = vsubps_avx(auVar59,auVar64);
  auVar51 = vaddps_avx512vl(auVar54,auVar62);
  auVar65._0_4_ = fVar230 + auVar64._0_4_;
  auVar65._4_4_ = fVar246 + auVar64._4_4_;
  auVar65._8_4_ = fVar241 + auVar64._8_4_;
  auVar65._12_4_ = fVar242 + auVar64._12_4_;
  auVar50 = vshufps_avx512vl(auVar60,auVar60,0xff);
  auVar254._0_4_ = auVar50._0_4_ * auVar277._0_4_;
  auVar254._4_4_ = auVar50._4_4_ * auVar277._4_4_;
  auVar254._8_4_ = auVar50._8_4_ * auVar277._8_4_;
  auVar254._12_4_ = auVar50._12_4_ * auVar277._12_4_;
  auVar62 = vsubps_avx512vl(auVar60,auVar254);
  auVar64 = vshufps_avx512vl(auVar61,auVar61,0xff);
  auVar64 = vmulps_avx512vl(auVar64,auVar277);
  auVar170._0_4_ = auVar64._0_4_ + auVar50._0_4_ * fVar142 * auVar52._0_4_ * fVar111;
  auVar170._4_4_ = auVar64._4_4_ + auVar50._4_4_ * fVar142 * auVar52._4_4_ * fVar111;
  auVar170._8_4_ = auVar64._8_4_ + auVar50._8_4_ * fVar142 * auVar52._8_4_ * fVar111;
  auVar170._12_4_ = auVar64._12_4_ + auVar50._12_4_ * fVar142 * auVar52._12_4_ * fVar111;
  auVar52 = vsubps_avx(auVar61,auVar170);
  auVar50 = vaddps_avx512vl(auVar60,auVar254);
  auVar171._0_4_ = auVar61._0_4_ + auVar170._0_4_;
  auVar171._4_4_ = auVar61._4_4_ + auVar170._4_4_;
  auVar171._8_4_ = auVar61._8_4_ + auVar170._8_4_;
  auVar171._12_4_ = auVar61._12_4_ + auVar170._12_4_;
  auVar42 = vmulps_avx512vl(auVar42,auVar45);
  auVar181._0_4_ = auVar63._0_4_ + auVar42._0_4_;
  auVar181._4_4_ = auVar63._4_4_ + auVar42._4_4_;
  auVar181._8_4_ = auVar63._8_4_ + auVar42._8_4_;
  auVar181._12_4_ = auVar63._12_4_ + auVar42._12_4_;
  auVar42 = vmulps_avx512vl(auVar52,auVar45);
  auVar42 = vsubps_avx(auVar62,auVar42);
  auVar52 = vmulps_avx512vl(auVar65,auVar45);
  auVar121._0_4_ = auVar51._0_4_ + auVar52._0_4_;
  auVar121._4_4_ = auVar51._4_4_ + auVar52._4_4_;
  auVar121._8_4_ = auVar51._8_4_ + auVar52._8_4_;
  auVar121._12_4_ = auVar51._12_4_ + auVar52._12_4_;
  auVar52 = vmulps_avx512vl(auVar171,auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar287 = ZEXT1664(auVar45);
  auVar52 = vsubps_avx(auVar50,auVar52);
  auVar61 = vbroadcastss_avx512vl(auVar44);
  auVar64 = vsubss_avx512f(ZEXT416(0x3f800000),auVar44);
  auVar278._0_4_ = auVar64._0_4_;
  auVar278._4_4_ = auVar278._0_4_;
  auVar278._8_4_ = auVar278._0_4_;
  auVar278._12_4_ = auVar278._0_4_;
  auVar63 = vmulps_avx512vl(auVar61,auVar63);
  auVar64 = vmulps_avx512vl(auVar61,auVar181);
  auVar42 = vmulps_avx512vl(auVar61,auVar42);
  auVar269._0_4_ = auVar61._0_4_ * auVar62._0_4_;
  auVar269._4_4_ = auVar61._4_4_ * auVar62._4_4_;
  auVar269._8_4_ = auVar61._8_4_ * auVar62._8_4_;
  auVar269._12_4_ = auVar61._12_4_ * auVar62._12_4_;
  local_510 = vfmadd231ps_avx512vl(auVar63,auVar278,auVar55);
  local_520 = vfmadd231ps_avx512vl(auVar64,auVar278,auVar190);
  local_530 = vfmadd231ps_avx512vl(auVar42,auVar278,auVar58);
  local_540 = vfmadd231ps_fma(auVar269,auVar278,auVar57);
  auVar42 = vmulps_avx512vl(auVar61,auVar51);
  auVar51 = vmulps_avx512vl(auVar61,auVar121);
  auVar52 = vmulps_avx512vl(auVar61,auVar52);
  auVar263._0_4_ = auVar61._0_4_ * auVar50._0_4_;
  auVar263._4_4_ = auVar61._4_4_ * auVar50._4_4_;
  auVar263._8_4_ = auVar61._8_4_ * auVar50._8_4_;
  auVar263._12_4_ = auVar61._12_4_ * auVar50._12_4_;
  _local_550 = vfmadd231ps_avx512vl(auVar42,auVar278,auVar56);
  _local_560 = vfmadd231ps_avx512vl(auVar51,auVar278,auVar48);
  _local_570 = vfmadd231ps_avx512vl(auVar52,auVar278,auVar53);
  _local_580 = vfmadd231ps_fma(auVar263,auVar278,auVar43);
  auVar42 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar42 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_490 = vsubps_avx512vl(local_510,auVar42);
  uVar112 = local_490._0_4_;
  auVar44._4_4_ = uVar112;
  auVar44._0_4_ = uVar112;
  auVar44._8_4_ = uVar112;
  auVar44._12_4_ = uVar112;
  auVar52 = vshufps_avx(local_490,local_490,0x55);
  auVar51 = vshufps_avx(local_490,local_490,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar142 = pre->ray_space[k].vz.field_0.m128[0];
  fVar111 = pre->ray_space[k].vz.field_0.m128[1];
  fVar230 = pre->ray_space[k].vz.field_0.m128[2];
  fVar246 = pre->ray_space[k].vz.field_0.m128[3];
  auVar62._0_4_ = fVar142 * auVar51._0_4_;
  auVar62._4_4_ = fVar111 * auVar51._4_4_;
  auVar62._8_4_ = fVar230 * auVar51._8_4_;
  auVar62._12_4_ = fVar246 * auVar51._12_4_;
  auVar52 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar5,auVar52);
  auVar57 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar44);
  local_4a0 = vsubps_avx512vl(local_520,auVar42);
  uVar112 = local_4a0._0_4_;
  auVar143._4_4_ = uVar112;
  auVar143._0_4_ = uVar112;
  auVar143._8_4_ = uVar112;
  auVar143._12_4_ = uVar112;
  auVar52 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar51 = vshufps_avx(local_4a0,local_4a0,0xaa);
  auVar46._0_4_ = fVar142 * auVar51._0_4_;
  auVar46._4_4_ = fVar111 * auVar51._4_4_;
  auVar46._8_4_ = fVar230 * auVar51._8_4_;
  auVar46._12_4_ = fVar246 * auVar51._12_4_;
  auVar52 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar5,auVar52);
  auVar61 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar143);
  local_4b0 = vsubps_avx512vl(local_530,auVar42);
  uVar112 = local_4b0._0_4_;
  auVar144._4_4_ = uVar112;
  auVar144._0_4_ = uVar112;
  auVar144._8_4_ = uVar112;
  auVar144._12_4_ = uVar112;
  auVar52 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar51 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar208._0_4_ = auVar51._0_4_ * fVar142;
  auVar208._4_4_ = auVar51._4_4_ * fVar111;
  auVar208._8_4_ = auVar51._8_4_ * fVar230;
  auVar208._12_4_ = auVar51._12_4_ * fVar246;
  auVar52 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar5,auVar52);
  auVar62 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar144);
  local_4c0 = vsubps_avx(local_540,auVar42);
  uVar112 = local_4c0._0_4_;
  auVar145._4_4_ = uVar112;
  auVar145._0_4_ = uVar112;
  auVar145._8_4_ = uVar112;
  auVar145._12_4_ = uVar112;
  auVar52 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar51 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar221._0_4_ = auVar51._0_4_ * fVar142;
  auVar221._4_4_ = auVar51._4_4_ * fVar111;
  auVar221._8_4_ = auVar51._8_4_ * fVar230;
  auVar221._12_4_ = auVar51._12_4_ * fVar246;
  auVar52 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar5,auVar52);
  auVar63 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar145);
  local_4d0 = vsubps_avx512vl(_local_550,auVar42);
  uVar112 = local_4d0._0_4_;
  auVar146._4_4_ = uVar112;
  auVar146._0_4_ = uVar112;
  auVar146._8_4_ = uVar112;
  auVar146._12_4_ = uVar112;
  auVar52 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar51 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar231._0_4_ = auVar51._0_4_ * fVar142;
  auVar231._4_4_ = auVar51._4_4_ * fVar111;
  auVar231._8_4_ = auVar51._8_4_ * fVar230;
  auVar231._12_4_ = auVar51._12_4_ * fVar246;
  auVar52 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar5,auVar52);
  auVar64 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar146);
  local_4e0 = vsubps_avx512vl(_local_560,auVar42);
  uVar112 = local_4e0._0_4_;
  auVar147._4_4_ = uVar112;
  auVar147._0_4_ = uVar112;
  auVar147._8_4_ = uVar112;
  auVar147._12_4_ = uVar112;
  auVar52 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar51 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar247._0_4_ = auVar51._0_4_ * fVar142;
  auVar247._4_4_ = auVar51._4_4_ * fVar111;
  auVar247._8_4_ = auVar51._8_4_ * fVar230;
  auVar247._12_4_ = auVar51._12_4_ * fVar246;
  auVar52 = vfmadd231ps_fma(auVar247,(undefined1  [16])aVar5,auVar52);
  auVar65 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar147);
  local_4f0 = vsubps_avx512vl(_local_570,auVar42);
  uVar112 = local_4f0._0_4_;
  auVar148._4_4_ = uVar112;
  auVar148._0_4_ = uVar112;
  auVar148._8_4_ = uVar112;
  auVar148._12_4_ = uVar112;
  auVar52 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar51 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar255._0_4_ = auVar51._0_4_ * fVar142;
  auVar255._4_4_ = auVar51._4_4_ * fVar111;
  auVar255._8_4_ = auVar51._8_4_ * fVar230;
  auVar255._12_4_ = auVar51._12_4_ * fVar246;
  auVar52 = vfmadd231ps_fma(auVar255,(undefined1  [16])aVar5,auVar52);
  auVar66 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar148);
  local_500 = vsubps_avx(_local_580,auVar42);
  uVar112 = local_500._0_4_;
  auVar130._4_4_ = uVar112;
  auVar130._0_4_ = uVar112;
  auVar130._8_4_ = uVar112;
  auVar130._12_4_ = uVar112;
  auVar42 = vshufps_avx(local_500,local_500,0x55);
  auVar52 = vshufps_avx(local_500,local_500,0xaa);
  auVar182._0_4_ = fVar142 * auVar52._0_4_;
  auVar182._4_4_ = fVar111 * auVar52._4_4_;
  auVar182._8_4_ = fVar230 * auVar52._8_4_;
  auVar182._12_4_ = fVar246 * auVar52._12_4_;
  auVar42 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar5,auVar42);
  auVar121 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar130);
  auVar56 = vmovlhps_avx512f(auVar57,auVar64);
  auVar51 = vmovlhps_avx(auVar61,auVar65);
  auVar50 = vmovlhps_avx(auVar62,auVar66);
  auVar58 = vmovlhps_avx(auVar63,auVar121);
  auVar52 = vminps_avx512vl(auVar56,auVar51);
  auVar55 = vmaxps_avx512vl(auVar56,auVar51);
  auVar42 = vminps_avx(auVar50,auVar58);
  auVar52 = vminps_avx(auVar52,auVar42);
  auVar42 = vmaxps_avx(auVar50,auVar58);
  auVar42 = vmaxps_avx(auVar55,auVar42);
  auVar55 = vshufpd_avx(auVar52,auVar52,3);
  auVar52 = vminps_avx(auVar52,auVar55);
  auVar55 = vshufpd_avx(auVar42,auVar42,3);
  auVar42 = vmaxps_avx(auVar42,auVar55);
  auVar52 = vandps_avx512vl(auVar52,auVar45);
  auVar42 = vandps_avx512vl(auVar42,auVar45);
  auVar42 = vmaxps_avx(auVar52,auVar42);
  auVar52 = vmovshdup_avx(auVar42);
  auVar42 = vmaxss_avx(auVar52,auVar42);
  fVar111 = auVar42._0_4_ * 9.536743e-07;
  auVar52 = vmovddup_avx512vl(auVar57);
  auVar55 = vmovddup_avx512vl(auVar61);
  auVar209._0_8_ = auVar62._0_8_;
  auVar209._8_8_ = auVar209._0_8_;
  auVar222._0_8_ = auVar63._0_8_;
  auVar222._8_8_ = auVar222._0_8_;
  local_3c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar111));
  auVar42 = vxorps_avx512vl(local_3c0._0_16_,auVar67);
  local_3e0 = vbroadcastss_avx512vl(auVar42);
  bVar40 = false;
  uVar31 = 0;
  fVar142 = *(float *)(ray + k * 4 + 0xc0);
  auVar93._0_16_ = vsubps_avx512vl(auVar51,auVar56);
  local_470 = vsubps_avx(auVar50,auVar51);
  local_480 = vsubps_avx(auVar58,auVar50);
  local_590 = vsubps_avx512vl(_local_550,local_510);
  local_5a0 = vsubps_avx512vl(_local_560,local_520);
  local_5b0 = vsubps_avx512vl(_local_570,local_530);
  _local_5c0 = vsubps_avx(_local_580,local_540);
  auVar116 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar116);
  auVar42 = ZEXT816(0x3f80000000000000);
  auVar282 = ZEXT1664(auVar42);
  auVar94._32_32_ = auVar116._32_32_;
  do {
    auVar53 = auVar282._0_16_;
    auVar61 = vshufps_avx512vl(auVar53,auVar53,0x50);
    auVar264._8_4_ = 0x3f800000;
    auVar264._0_8_ = &DAT_3f8000003f800000;
    auVar264._12_4_ = 0x3f800000;
    auVar267._16_4_ = 0x3f800000;
    auVar267._0_16_ = auVar264;
    auVar267._20_4_ = 0x3f800000;
    auVar267._24_4_ = 0x3f800000;
    auVar267._28_4_ = 0x3f800000;
    auVar57 = vsubps_avx(auVar264,auVar61);
    fVar230 = auVar61._0_4_;
    fVar117 = auVar64._0_4_;
    auVar149._0_4_ = fVar117 * fVar230;
    fVar246 = auVar61._4_4_;
    fVar118 = auVar64._4_4_;
    auVar149._4_4_ = fVar118 * fVar246;
    fVar241 = auVar61._8_4_;
    auVar149._8_4_ = fVar117 * fVar241;
    fVar242 = auVar61._12_4_;
    auVar149._12_4_ = fVar118 * fVar242;
    fVar119 = auVar65._0_4_;
    auVar160._0_4_ = fVar119 * fVar230;
    fVar141 = auVar65._4_4_;
    auVar160._4_4_ = fVar141 * fVar246;
    auVar160._8_4_ = fVar119 * fVar241;
    auVar160._12_4_ = fVar141 * fVar242;
    fVar229 = auVar66._0_4_;
    auVar172._0_4_ = fVar229 * fVar230;
    fVar240 = auVar66._4_4_;
    auVar172._4_4_ = fVar240 * fVar246;
    auVar172._8_4_ = fVar229 * fVar241;
    auVar172._12_4_ = fVar240 * fVar242;
    fVar158 = auVar121._0_4_;
    auVar122._0_4_ = fVar158 * fVar230;
    fVar188 = auVar121._4_4_;
    auVar122._4_4_ = fVar188 * fVar246;
    auVar122._8_4_ = fVar158 * fVar241;
    auVar122._12_4_ = fVar188 * fVar242;
    auVar63 = vfmadd231ps_avx512vl(auVar149,auVar57,auVar52);
    auVar43 = vfmadd231ps_avx512vl(auVar160,auVar57,auVar55);
    auVar61 = vfmadd231ps_fma(auVar172,auVar57,auVar209);
    auVar62 = vfmadd231ps_fma(auVar122,auVar222,auVar57);
    auVar57 = vmovshdup_avx(auVar42);
    fVar230 = auVar42._0_4_;
    auVar45 = vmulss_avx512f(ZEXT416((uint)(auVar57._0_4_ - fVar230)),ZEXT416(0x3d430c31));
    auVar202._4_4_ = fVar230;
    auVar202._0_4_ = fVar230;
    auVar202._8_4_ = fVar230;
    auVar202._12_4_ = fVar230;
    auVar202._16_4_ = fVar230;
    auVar202._20_4_ = fVar230;
    auVar202._24_4_ = fVar230;
    auVar202._28_4_ = fVar230;
    auVar138._0_8_ = auVar57._0_8_;
    auVar138._8_8_ = auVar138._0_8_;
    auVar138._16_8_ = auVar138._0_8_;
    auVar138._24_8_ = auVar138._0_8_;
    auVar74 = vsubps_avx(auVar138,auVar202);
    uVar112 = auVar63._0_4_;
    auVar139._4_4_ = uVar112;
    auVar139._0_4_ = uVar112;
    auVar139._8_4_ = uVar112;
    auVar139._12_4_ = uVar112;
    auVar139._16_4_ = uVar112;
    auVar139._20_4_ = uVar112;
    auVar139._24_4_ = uVar112;
    auVar139._28_4_ = uVar112;
    auVar226._8_4_ = 1;
    auVar226._0_8_ = 0x100000001;
    auVar226._12_4_ = 1;
    auVar226._16_4_ = 1;
    auVar226._20_4_ = 1;
    auVar226._24_4_ = 1;
    auVar226._28_4_ = 1;
    auVar86 = ZEXT1632(auVar63);
    auVar73 = vpermps_avx2(auVar226,auVar86);
    auVar75 = vbroadcastss_avx512vl(auVar43);
    auVar87 = ZEXT1632(auVar43);
    auVar76 = vpermps_avx512vl(auVar226,auVar87);
    auVar77 = vbroadcastss_avx512vl(auVar61);
    auVar71 = ZEXT1632(auVar61);
    auVar78 = vpermps_avx512vl(auVar226,auVar71);
    auVar79 = vbroadcastss_avx512vl(auVar62);
    auVar84 = ZEXT1632(auVar62);
    auVar80 = vpermps_avx512vl(auVar226,auVar84);
    fVar246 = auVar45._0_4_;
    auVar227._4_4_ = fVar246;
    auVar227._0_4_ = fVar246;
    auVar227._8_4_ = fVar246;
    auVar227._12_4_ = fVar246;
    auVar227._16_4_ = fVar246;
    auVar227._20_4_ = fVar246;
    auVar227._24_4_ = fVar246;
    auVar227._28_4_ = fVar246;
    auVar186._8_4_ = 2;
    auVar186._0_8_ = 0x200000002;
    auVar186._12_4_ = 2;
    auVar186._16_4_ = 2;
    auVar186._20_4_ = 2;
    auVar186._24_4_ = 2;
    auVar186._28_4_ = 2;
    auVar72 = vpermps_avx512vl(auVar186,auVar86);
    auVar81 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar82 = vpermps_avx512vl(auVar81,auVar86);
    auVar86 = vpermps_avx2(auVar186,auVar87);
    auVar70 = vpermps_avx512vl(auVar81,auVar87);
    auVar87 = vpermps_avx2(auVar186,auVar71);
    auVar71 = vpermps_avx512vl(auVar81,auVar71);
    auVar83 = vpermps_avx512vl(auVar186,auVar84);
    auVar81 = vpermps_avx512vl(auVar81,auVar84);
    auVar57 = vfmadd132ps_fma(auVar74,auVar202,_DAT_02020f20);
    auVar74 = vsubps_avx(auVar267,ZEXT1632(auVar57));
    auVar84 = vmulps_avx512vl(auVar75,ZEXT1632(auVar57));
    auVar88 = ZEXT1632(auVar57);
    auVar85 = vmulps_avx512vl(auVar76,auVar88);
    auVar61 = vfmadd231ps_fma(auVar84,auVar74,auVar139);
    auVar62 = vfmadd231ps_fma(auVar85,auVar74,auVar73);
    auVar84 = vmulps_avx512vl(auVar77,auVar88);
    auVar85 = vmulps_avx512vl(auVar78,auVar88);
    auVar75 = vfmadd231ps_avx512vl(auVar84,auVar74,auVar75);
    auVar76 = vfmadd231ps_avx512vl(auVar85,auVar74,auVar76);
    auVar84 = vmulps_avx512vl(auVar79,auVar88);
    auVar85 = ZEXT1632(auVar57);
    auVar80 = vmulps_avx512vl(auVar80,auVar85);
    auVar77 = vfmadd231ps_avx512vl(auVar84,auVar74,auVar77);
    auVar78 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar78);
    fVar241 = auVar57._0_4_;
    fVar242 = auVar57._4_4_;
    auVar22._4_4_ = fVar242 * auVar75._4_4_;
    auVar22._0_4_ = fVar241 * auVar75._0_4_;
    fVar243 = auVar57._8_4_;
    auVar22._8_4_ = fVar243 * auVar75._8_4_;
    fVar244 = auVar57._12_4_;
    auVar22._12_4_ = fVar244 * auVar75._12_4_;
    auVar22._16_4_ = auVar75._16_4_ * 0.0;
    auVar22._20_4_ = auVar75._20_4_ * 0.0;
    auVar22._24_4_ = auVar75._24_4_ * 0.0;
    auVar22._28_4_ = fVar230;
    auVar23._4_4_ = fVar242 * auVar76._4_4_;
    auVar23._0_4_ = fVar241 * auVar76._0_4_;
    auVar23._8_4_ = fVar243 * auVar76._8_4_;
    auVar23._12_4_ = fVar244 * auVar76._12_4_;
    auVar23._16_4_ = auVar76._16_4_ * 0.0;
    auVar23._20_4_ = auVar76._20_4_ * 0.0;
    auVar23._24_4_ = auVar76._24_4_ * 0.0;
    auVar23._28_4_ = auVar73._28_4_;
    auVar61 = vfmadd231ps_fma(auVar22,auVar74,ZEXT1632(auVar61));
    auVar62 = vfmadd231ps_fma(auVar23,auVar74,ZEXT1632(auVar62));
    auVar128._0_4_ = fVar241 * auVar77._0_4_;
    auVar128._4_4_ = fVar242 * auVar77._4_4_;
    auVar128._8_4_ = fVar243 * auVar77._8_4_;
    auVar128._12_4_ = fVar244 * auVar77._12_4_;
    auVar128._16_4_ = auVar77._16_4_ * 0.0;
    auVar128._20_4_ = auVar77._20_4_ * 0.0;
    auVar128._24_4_ = auVar77._24_4_ * 0.0;
    auVar128._28_4_ = 0;
    auVar24._4_4_ = fVar242 * auVar78._4_4_;
    auVar24._0_4_ = fVar241 * auVar78._0_4_;
    auVar24._8_4_ = fVar243 * auVar78._8_4_;
    auVar24._12_4_ = fVar244 * auVar78._12_4_;
    auVar24._16_4_ = auVar78._16_4_ * 0.0;
    auVar24._20_4_ = auVar78._20_4_ * 0.0;
    auVar24._24_4_ = auVar78._24_4_ * 0.0;
    auVar24._28_4_ = auVar77._28_4_;
    auVar63 = vfmadd231ps_fma(auVar128,auVar74,auVar75);
    auVar43 = vfmadd231ps_fma(auVar24,auVar74,auVar76);
    auVar25._28_4_ = auVar76._28_4_;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar244 * auVar43._12_4_,
                            CONCAT48(fVar243 * auVar43._8_4_,
                                     CONCAT44(fVar242 * auVar43._4_4_,fVar241 * auVar43._0_4_))));
    auVar45 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar244 * auVar63._12_4_,
                                                 CONCAT48(fVar243 * auVar63._8_4_,
                                                          CONCAT44(fVar242 * auVar63._4_4_,
                                                                   fVar241 * auVar63._0_4_)))),
                              auVar74,ZEXT1632(auVar61));
    auVar48 = vfmadd231ps_fma(auVar25,auVar74,ZEXT1632(auVar62));
    auVar73 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar61));
    auVar75 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar62));
    auVar76 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar73 = vmulps_avx512vl(auVar73,auVar76);
    auVar75 = vmulps_avx512vl(auVar75,auVar76);
    auVar218._0_4_ = fVar246 * auVar73._0_4_;
    auVar218._4_4_ = fVar246 * auVar73._4_4_;
    auVar218._8_4_ = fVar246 * auVar73._8_4_;
    auVar218._12_4_ = fVar246 * auVar73._12_4_;
    auVar218._16_4_ = fVar246 * auVar73._16_4_;
    auVar218._20_4_ = fVar246 * auVar73._20_4_;
    auVar218._24_4_ = fVar246 * auVar73._24_4_;
    auVar218._28_4_ = 0;
    auVar73 = vmulps_avx512vl(auVar227,auVar75);
    auVar63 = vxorps_avx512vl(auVar79._0_16_,auVar79._0_16_);
    auVar75 = vpermt2ps_avx512vl(ZEXT1632(auVar45),_DAT_0205fd20,ZEXT1632(auVar63));
    auVar77 = vpermt2ps_avx512vl(ZEXT1632(auVar48),_DAT_0205fd20,ZEXT1632(auVar63));
    auVar129._0_4_ = auVar218._0_4_ + auVar45._0_4_;
    auVar129._4_4_ = auVar218._4_4_ + auVar45._4_4_;
    auVar129._8_4_ = auVar218._8_4_ + auVar45._8_4_;
    auVar129._12_4_ = auVar218._12_4_ + auVar45._12_4_;
    auVar129._16_4_ = auVar218._16_4_ + 0.0;
    auVar129._20_4_ = auVar218._20_4_ + 0.0;
    auVar129._24_4_ = auVar218._24_4_ + 0.0;
    auVar129._28_4_ = 0;
    auVar88 = ZEXT1632(auVar63);
    auVar78 = vpermt2ps_avx512vl(auVar218,_DAT_0205fd20,auVar88);
    auVar79 = vaddps_avx512vl(ZEXT1632(auVar48),auVar73);
    auVar80 = vpermt2ps_avx512vl(auVar73,_DAT_0205fd20,auVar88);
    auVar73 = vsubps_avx(auVar75,auVar78);
    auVar78 = vsubps_avx512vl(auVar77,auVar80);
    auVar80 = vmulps_avx512vl(auVar86,auVar85);
    auVar84 = vmulps_avx512vl(auVar70,auVar85);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar72);
    auVar72 = vfmadd231ps_avx512vl(auVar84,auVar74,auVar82);
    auVar82 = vmulps_avx512vl(auVar87,auVar85);
    auVar84 = vmulps_avx512vl(auVar71,auVar85);
    auVar86 = vfmadd231ps_avx512vl(auVar82,auVar74,auVar86);
    auVar82 = vfmadd231ps_avx512vl(auVar84,auVar74,auVar70);
    auVar70 = vmulps_avx512vl(auVar83,auVar85);
    auVar81 = vmulps_avx512vl(auVar81,auVar85);
    auVar61 = vfmadd231ps_fma(auVar70,auVar74,auVar87);
    auVar62 = vfmadd231ps_fma(auVar81,auVar74,auVar71);
    auVar81 = vmulps_avx512vl(auVar85,auVar86);
    auVar70 = vmulps_avx512vl(ZEXT1632(auVar57),auVar82);
    auVar80 = vfmadd231ps_avx512vl(auVar81,auVar74,auVar80);
    auVar72 = vfmadd231ps_avx512vl(auVar70,auVar74,auVar72);
    auVar86 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar244 * auVar61._12_4_,
                                            CONCAT48(fVar243 * auVar61._8_4_,
                                                     CONCAT44(fVar242 * auVar61._4_4_,
                                                              fVar241 * auVar61._0_4_)))),auVar74,
                         auVar86);
    auVar81 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar244 * auVar62._12_4_,
                                            CONCAT48(fVar243 * auVar62._8_4_,
                                                     CONCAT44(fVar242 * auVar62._4_4_,
                                                              fVar241 * auVar62._0_4_)))),auVar74,
                         auVar82);
    auVar26._4_4_ = fVar242 * auVar86._4_4_;
    auVar26._0_4_ = fVar241 * auVar86._0_4_;
    auVar26._8_4_ = fVar243 * auVar86._8_4_;
    auVar26._12_4_ = fVar244 * auVar86._12_4_;
    auVar26._16_4_ = auVar86._16_4_ * 0.0;
    auVar26._20_4_ = auVar86._20_4_ * 0.0;
    auVar26._24_4_ = auVar86._24_4_ * 0.0;
    auVar26._28_4_ = auVar71._28_4_;
    auVar27._4_4_ = fVar242 * auVar81._4_4_;
    auVar27._0_4_ = fVar241 * auVar81._0_4_;
    auVar27._8_4_ = fVar243 * auVar81._8_4_;
    auVar27._12_4_ = fVar244 * auVar81._12_4_;
    auVar27._16_4_ = auVar81._16_4_ * 0.0;
    auVar27._20_4_ = auVar81._20_4_ * 0.0;
    auVar27._24_4_ = auVar81._24_4_ * 0.0;
    auVar27._28_4_ = auVar87._28_4_;
    auVar87 = vfmadd231ps_avx512vl(auVar26,auVar74,auVar80);
    auVar82 = vfmadd231ps_avx512vl(auVar27,auVar72,auVar74);
    auVar74 = vsubps_avx512vl(auVar86,auVar80);
    auVar86 = vsubps_avx512vl(auVar81,auVar72);
    auVar74 = vmulps_avx512vl(auVar74,auVar76);
    auVar86 = vmulps_avx512vl(auVar86,auVar76);
    fVar230 = fVar246 * auVar74._0_4_;
    fVar241 = fVar246 * auVar74._4_4_;
    auVar28._4_4_ = fVar241;
    auVar28._0_4_ = fVar230;
    fVar242 = fVar246 * auVar74._8_4_;
    auVar28._8_4_ = fVar242;
    fVar243 = fVar246 * auVar74._12_4_;
    auVar28._12_4_ = fVar243;
    fVar244 = fVar246 * auVar74._16_4_;
    auVar28._16_4_ = fVar244;
    fVar245 = fVar246 * auVar74._20_4_;
    auVar28._20_4_ = fVar245;
    fVar246 = fVar246 * auVar74._24_4_;
    auVar28._24_4_ = fVar246;
    auVar28._28_4_ = auVar74._28_4_;
    auVar86 = vmulps_avx512vl(auVar227,auVar86);
    auVar76 = vpermt2ps_avx512vl(auVar87,_DAT_0205fd20,auVar88);
    auVar80 = vpermt2ps_avx512vl(auVar82,_DAT_0205fd20,auVar88);
    auVar228._0_4_ = auVar87._0_4_ + fVar230;
    auVar228._4_4_ = auVar87._4_4_ + fVar241;
    auVar228._8_4_ = auVar87._8_4_ + fVar242;
    auVar228._12_4_ = auVar87._12_4_ + fVar243;
    auVar228._16_4_ = auVar87._16_4_ + fVar244;
    auVar228._20_4_ = auVar87._20_4_ + fVar245;
    auVar228._24_4_ = auVar87._24_4_ + fVar246;
    auVar228._28_4_ = auVar87._28_4_ + auVar74._28_4_;
    auVar74 = vpermt2ps_avx512vl(auVar28,_DAT_0205fd20,ZEXT1632(auVar63));
    auVar72 = vaddps_avx512vl(auVar82,auVar86);
    auVar86 = vpermt2ps_avx512vl(auVar86,_DAT_0205fd20,ZEXT1632(auVar63));
    auVar74 = vsubps_avx(auVar76,auVar74);
    auVar86 = vsubps_avx512vl(auVar80,auVar86);
    auVar155 = ZEXT1632(auVar45);
    auVar81 = vsubps_avx512vl(auVar87,auVar155);
    auVar164 = ZEXT1632(auVar48);
    auVar70 = vsubps_avx512vl(auVar82,auVar164);
    auVar71 = vsubps_avx512vl(auVar76,auVar75);
    auVar81 = vaddps_avx512vl(auVar81,auVar71);
    auVar71 = vsubps_avx512vl(auVar80,auVar77);
    auVar70 = vaddps_avx512vl(auVar70,auVar71);
    auVar71 = vmulps_avx512vl(auVar164,auVar81);
    auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar155,auVar70);
    auVar83 = vmulps_avx512vl(auVar79,auVar81);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar129,auVar70);
    auVar84 = vmulps_avx512vl(auVar78,auVar81);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar73,auVar70);
    auVar85 = vmulps_avx512vl(auVar77,auVar81);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar75,auVar70);
    auVar88 = vmulps_avx512vl(auVar82,auVar81);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar87,auVar70);
    auVar89 = vmulps_avx512vl(auVar72,auVar81);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar228,auVar70);
    auVar90 = vmulps_avx512vl(auVar86,auVar81);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar74,auVar70);
    auVar81 = vmulps_avx512vl(auVar80,auVar81);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar76,auVar70);
    auVar70 = vminps_avx512vl(auVar71,auVar83);
    auVar71 = vmaxps_avx512vl(auVar71,auVar83);
    auVar83 = vminps_avx512vl(auVar84,auVar85);
    auVar70 = vminps_avx512vl(auVar70,auVar83);
    auVar83 = vmaxps_avx512vl(auVar84,auVar85);
    auVar71 = vmaxps_avx512vl(auVar71,auVar83);
    auVar83 = vminps_avx512vl(auVar88,auVar89);
    auVar84 = vmaxps_avx512vl(auVar88,auVar89);
    auVar85 = vminps_avx512vl(auVar90,auVar81);
    auVar83 = vminps_avx512vl(auVar83,auVar85);
    auVar70 = vminps_avx512vl(auVar70,auVar83);
    auVar81 = vmaxps_avx512vl(auVar90,auVar81);
    auVar81 = vmaxps_avx512vl(auVar84,auVar81);
    auVar81 = vmaxps_avx512vl(auVar71,auVar81);
    auVar57 = auVar81._0_16_;
    uVar15 = vcmpps_avx512vl(auVar70,local_3c0,2);
    uVar17 = vcmpps_avx512vl(auVar81,local_3e0,5);
    uVar37 = 0;
    bVar29 = (byte)uVar15 & (byte)uVar17 & 0x7f;
    if (bVar29 != 0) {
      auVar81 = vsubps_avx512vl(auVar75,auVar155);
      auVar70 = vsubps_avx512vl(auVar77,auVar164);
      auVar71 = vsubps_avx512vl(auVar76,auVar87);
      auVar81 = vaddps_avx512vl(auVar81,auVar71);
      auVar57 = auVar81._0_16_;
      auVar71 = vsubps_avx512vl(auVar80,auVar82);
      auVar70 = vaddps_avx512vl(auVar70,auVar71);
      auVar71 = vmulps_avx512vl(auVar164,auVar81);
      auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar70,auVar155);
      auVar79 = vmulps_avx512vl(auVar79,auVar81);
      auVar79 = vfnmadd213ps_avx512vl(auVar129,auVar70,auVar79);
      auVar78 = vmulps_avx512vl(auVar78,auVar81);
      auVar78 = vfnmadd213ps_avx512vl(auVar73,auVar70,auVar78);
      auVar73 = vmulps_avx512vl(auVar77,auVar81);
      auVar77 = vfnmadd231ps_avx512vl(auVar73,auVar70,auVar75);
      auVar73 = vmulps_avx512vl(auVar82,auVar81);
      auVar87 = vfnmadd231ps_avx512vl(auVar73,auVar70,auVar87);
      auVar73 = vmulps_avx512vl(auVar72,auVar81);
      auVar72 = vfnmadd213ps_avx512vl(auVar228,auVar70,auVar73);
      auVar73 = vmulps_avx512vl(auVar86,auVar81);
      auVar82 = vfnmadd213ps_avx512vl(auVar74,auVar70,auVar73);
      auVar74 = vmulps_avx512vl(auVar80,auVar81);
      auVar76 = vfnmadd231ps_avx512vl(auVar74,auVar76,auVar70);
      auVar73 = vminps_avx(auVar71,auVar79);
      auVar74 = vmaxps_avx(auVar71,auVar79);
      auVar75 = vminps_avx(auVar78,auVar77);
      auVar75 = vminps_avx(auVar73,auVar75);
      auVar73 = vmaxps_avx(auVar78,auVar77);
      auVar74 = vmaxps_avx(auVar74,auVar73);
      auVar86 = vminps_avx(auVar87,auVar72);
      auVar73 = vmaxps_avx(auVar87,auVar72);
      auVar87 = vminps_avx(auVar82,auVar76);
      auVar86 = vminps_avx(auVar86,auVar87);
      auVar86 = vminps_avx(auVar75,auVar86);
      auVar75 = vmaxps_avx(auVar82,auVar76);
      auVar73 = vmaxps_avx(auVar73,auVar75);
      auVar74 = vmaxps_avx(auVar74,auVar73);
      uVar15 = vcmpps_avx512vl(auVar74,local_3e0,5);
      uVar17 = vcmpps_avx512vl(auVar86,local_3c0,2);
      uVar37 = (uint)(bVar29 & (byte)uVar15 & (byte)uVar17);
    }
    if (uVar37 != 0) {
      auStack_600[uVar31] = uVar37;
      uVar15 = vmovlps_avx(auVar42);
      *(undefined8 *)(&uStack_460 + uVar31 * 2) = uVar15;
      uVar3 = vmovlps_avx(auVar53);
      auStack_3a0[uVar31] = uVar3;
      uVar31 = (ulong)((int)uVar31 + 1);
    }
    auVar42 = vxorps_avx512vl(auVar57,auVar57);
    auVar116 = ZEXT1664(auVar42);
    auVar92._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar92._32_32_ = auVar94._32_32_;
    auVar284 = ZEXT3264(auVar92._0_32_);
    in_ZMM21 = ZEXT464(0x3a83126f);
    auVar93._16_48_ = auVar92._16_48_;
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar285 = ZEXT1664(auVar42);
    auVar108 = auVar93;
    do {
      auVar42 = auVar116._0_16_;
      auVar57 = auVar285._0_16_;
      auVar61 = SUB6416(ZEXT464(0xb8d1b717),0);
      if ((int)uVar31 == 0) {
        if (bVar40) {
          return local_765;
        }
        uVar112 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar21._4_4_ = uVar112;
        auVar21._0_4_ = uVar112;
        auVar21._8_4_ = uVar112;
        auVar21._12_4_ = uVar112;
        auVar21._16_4_ = uVar112;
        auVar21._20_4_ = uVar112;
        auVar21._24_4_ = uVar112;
        auVar21._28_4_ = uVar112;
        uVar15 = vcmpps_avx512vl(local_400,auVar21,2);
        uVar39 = (uint)uVar34 & (uint)uVar34 + 0xff & (uint)uVar15;
        uVar34 = (ulong)uVar39;
        local_765 = uVar39 != 0;
        if (!local_765) {
          return local_765;
        }
        goto LAB_01ec8468;
      }
      uVar30 = (int)uVar31 - 1;
      uVar32 = (ulong)uVar30;
      uVar37 = (&uStack_460)[uVar32 * 2];
      fVar230 = afStack_45c[uVar32 * 2];
      uVar7 = auStack_600[uVar32];
      uVar3 = auStack_3a0[uVar32];
      auVar282 = ZEXT864(uVar3);
      lVar36 = 0;
      for (uVar35 = (ulong)uVar7; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
        lVar36 = lVar36 + 1;
      }
      uVar33 = uVar7 - 1 & uVar7;
      auStack_600[uVar32] = uVar33;
      if (uVar33 == 0) {
        uVar31 = (ulong)uVar30;
      }
      auVar131._0_4_ = (float)lVar36;
      auVar131._4_8_ = SUB128(ZEXT812(0),4);
      auVar131._12_4_ = 0;
      auVar94._32_32_ = auVar108._32_32_;
      auVar62 = vmulss_avx512f(auVar131,SUB6416(ZEXT464(0x3e124925),0));
      lVar36 = lVar36 + 1;
      auVar63 = vmulss_avx512f(ZEXT416((uint)(float)lVar36),SUB6416(ZEXT464(0x3e124925),0));
      auVar45 = auVar286._0_16_;
      auVar43 = vsubss_avx512f(auVar45,auVar62);
      auVar62 = vmulss_avx512f(ZEXT416((uint)fVar230),auVar62);
      auVar109._0_16_ = vfmadd231ss_avx512f(auVar62,ZEXT416(uVar37),auVar43);
      auVar62 = vsubss_avx512f(auVar45,auVar63);
      auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar230 * auVar63._0_4_)),ZEXT416(uVar37),auVar62);
      auVar63 = vsubss_avx512f(auVar62,auVar109._0_16_);
      vucomiss_avx512f(auVar63);
      if (uVar7 == 0 || lVar36 == 0) break;
      auVar280._8_8_ = 0;
      auVar280._0_8_ = uVar3;
      auVar48 = vshufps_avx512vl(auVar280,auVar280,0x50);
      auVar43 = vucomiss_avx512f(auVar63);
      in_ZMM21 = ZEXT1664(auVar43);
      uVar37 = (uint)uVar31;
      auVar54 = vsubps_avx512vl(auVar57,auVar48);
      fVar230 = auVar48._0_4_;
      auVar150._0_4_ = fVar230 * fVar117;
      fVar246 = auVar48._4_4_;
      auVar150._4_4_ = fVar246 * fVar118;
      fVar241 = auVar48._8_4_;
      auVar150._8_4_ = fVar241 * fVar117;
      fVar242 = auVar48._12_4_;
      auVar150._12_4_ = fVar242 * fVar118;
      auVar161._0_4_ = fVar230 * fVar119;
      auVar161._4_4_ = fVar246 * fVar141;
      auVar161._8_4_ = fVar241 * fVar119;
      auVar161._12_4_ = fVar242 * fVar141;
      auVar173._0_4_ = fVar230 * fVar229;
      auVar173._4_4_ = fVar246 * fVar240;
      auVar173._8_4_ = fVar241 * fVar229;
      auVar173._12_4_ = fVar242 * fVar240;
      auVar123._0_4_ = fVar230 * fVar158;
      auVar123._4_4_ = fVar246 * fVar188;
      auVar123._8_4_ = fVar241 * fVar158;
      auVar123._12_4_ = fVar242 * fVar188;
      auVar43 = vfmadd231ps_fma(auVar150,auVar54,auVar52);
      auVar48 = vfmadd231ps_fma(auVar161,auVar54,auVar55);
      auVar53 = vfmadd231ps_fma(auVar173,auVar54,auVar209);
      auVar54 = vfmadd231ps_fma(auVar123,auVar54,auVar222);
      auVar140._16_16_ = auVar43;
      auVar140._0_16_ = auVar43;
      auVar156._16_16_ = auVar48;
      auVar156._0_16_ = auVar48;
      auVar165._16_16_ = auVar53;
      auVar165._0_16_ = auVar53;
      auVar43 = vbroadcastss_avx512vl(auVar109._0_16_);
      uVar112 = auVar62._0_4_;
      auVar187._20_4_ = uVar112;
      auVar187._16_4_ = uVar112;
      auVar187._24_4_ = uVar112;
      auVar187._28_4_ = uVar112;
      auVar187._0_16_ = auVar43;
      auVar74 = vsubps_avx(auVar156,auVar140);
      auVar48 = vfmadd213ps_fma(auVar74,auVar187,auVar140);
      auVar74 = vsubps_avx(auVar165,auVar156);
      auVar59 = vfmadd213ps_fma(auVar74,auVar187,auVar156);
      auVar43 = vsubps_avx(auVar54,auVar53);
      auVar157._16_16_ = auVar43;
      auVar157._0_16_ = auVar43;
      auVar43 = vfmadd213ps_fma(auVar157,auVar187,auVar165);
      auVar74 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar48));
      auVar48 = vfmadd213ps_fma(auVar74,auVar187,ZEXT1632(auVar48));
      auVar74 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar59));
      auVar43 = vfmadd213ps_fma(auVar74,auVar187,ZEXT1632(auVar59));
      auVar74 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar48));
      auVar46 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar74,auVar187);
      auVar94._0_32_ = vmulps_avx512vl(auVar74,auVar284._0_32_);
      auVar108._16_48_ = auVar94._16_48_;
      auVar108._0_16_ = vmulss_avx512f(auVar63,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar230 = auVar108._0_4_;
      auVar174._0_8_ =
           CONCAT44(auVar46._4_4_ + fVar230 * auVar94._4_4_,auVar46._0_4_ + fVar230 * auVar94._0_4_)
      ;
      auVar174._8_4_ = auVar46._8_4_ + fVar230 * auVar94._8_4_;
      auVar174._12_4_ = auVar46._12_4_ + fVar230 * auVar94._12_4_;
      auVar151._0_4_ = fVar230 * auVar94._16_4_;
      auVar151._4_4_ = fVar230 * auVar94._20_4_;
      auVar151._8_4_ = fVar230 * auVar94._24_4_;
      auVar151._12_4_ = fVar230 * auVar94._28_4_;
      auVar69 = vsubps_avx((undefined1  [16])0x0,auVar151);
      auVar67 = vshufpd_avx(auVar46,auVar46,3);
      auVar47 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar43 = vsubps_avx(auVar67,auVar46);
      auVar48 = vsubps_avx(auVar47,(undefined1  [16])0x0);
      auVar191._0_4_ = auVar48._0_4_ + auVar43._0_4_;
      auVar191._4_4_ = auVar48._4_4_ + auVar43._4_4_;
      auVar191._8_4_ = auVar48._8_4_ + auVar43._8_4_;
      auVar191._12_4_ = auVar48._12_4_ + auVar43._12_4_;
      auVar43 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar48 = vshufps_avx(auVar174,auVar174,0xb1);
      auVar53 = vshufps_avx(auVar69,auVar69,0xb1);
      auVar54 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar256._4_4_ = auVar191._0_4_;
      auVar256._0_4_ = auVar191._0_4_;
      auVar256._8_4_ = auVar191._0_4_;
      auVar256._12_4_ = auVar191._0_4_;
      auVar59 = vshufps_avx(auVar191,auVar191,0x55);
      fVar230 = auVar59._0_4_;
      auVar210._0_4_ = auVar43._0_4_ * fVar230;
      fVar246 = auVar59._4_4_;
      auVar210._4_4_ = auVar43._4_4_ * fVar246;
      fVar241 = auVar59._8_4_;
      auVar210._8_4_ = auVar43._8_4_ * fVar241;
      fVar242 = auVar59._12_4_;
      auVar210._12_4_ = auVar43._12_4_ * fVar242;
      auVar223._0_4_ = auVar48._0_4_ * fVar230;
      auVar223._4_4_ = auVar48._4_4_ * fVar246;
      auVar223._8_4_ = auVar48._8_4_ * fVar241;
      auVar223._12_4_ = auVar48._12_4_ * fVar242;
      auVar232._0_4_ = auVar53._0_4_ * fVar230;
      auVar232._4_4_ = auVar53._4_4_ * fVar246;
      auVar232._8_4_ = auVar53._8_4_ * fVar241;
      auVar232._12_4_ = auVar53._12_4_ * fVar242;
      auVar192._0_4_ = auVar54._0_4_ * fVar230;
      auVar192._4_4_ = auVar54._4_4_ * fVar246;
      auVar192._8_4_ = auVar54._8_4_ * fVar241;
      auVar192._12_4_ = auVar54._12_4_ * fVar242;
      auVar43 = vfmadd231ps_fma(auVar210,auVar256,auVar46);
      auVar48 = vfmadd231ps_fma(auVar223,auVar256,auVar174);
      auVar59 = vfmadd231ps_fma(auVar232,auVar256,auVar69);
      auVar44 = vfmadd231ps_fma(auVar192,(undefined1  [16])0x0,auVar256);
      auVar60 = vshufpd_avx(auVar43,auVar43,1);
      auVar49 = vshufpd_avx(auVar48,auVar48,1);
      auVar68 = vshufpd_avx(auVar59,auVar59,1);
      auVar14 = vshufpd_avx(auVar44,auVar44,1);
      auVar53 = vminss_avx(auVar43,auVar48);
      auVar43 = vmaxss_avx(auVar48,auVar43);
      auVar54 = vminss_avx(auVar59,auVar44);
      auVar48 = vmaxss_avx(auVar44,auVar59);
      auVar54 = vminss_avx(auVar53,auVar54);
      auVar43 = vmaxss_avx(auVar48,auVar43);
      auVar59 = vminss_avx(auVar60,auVar49);
      auVar48 = vmaxss_avx(auVar49,auVar60);
      auVar60 = vminss_avx(auVar68,auVar14);
      auVar53 = vmaxss_avx(auVar14,auVar68);
      auVar59 = vminss_avx(auVar59,auVar60);
      auVar48 = vmaxss_avx(auVar53,auVar48);
      vucomiss_avx512f(auVar54);
      if ((uVar37 < 5) || (auVar48 = vucomiss_avx512f(auVar61), uVar37 < 5)) {
        auVar43 = vucomiss_avx512f(auVar61);
        uVar15 = vcmpps_avx512vl(auVar59,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar17 = vcmpps_avx512vl(auVar54,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((4 < uVar37 & ((byte)uVar17 | (byte)uVar15)) != 0) goto LAB_01ec97bb;
        uVar15 = vcmpps_avx512vl(auVar61,auVar48,5);
        uVar17 = vcmpps_avx512vl(auVar59,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar17 | (ushort)uVar15) & 1) == 0) goto LAB_01ec97bb;
        bVar16 = true;
      }
      else {
LAB_01ec97bb:
        auVar281._8_8_ = 0;
        auVar281._0_8_ = uVar3;
        uVar15 = vcmpss_avx512f(auVar54,auVar42,1);
        bVar16 = (bool)((byte)uVar15 & 1);
        iVar110 = auVar286._0_4_;
        fVar230 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar110);
        uVar15 = vcmpss_avx512f(auVar43,auVar42,1);
        bVar16 = (bool)((byte)uVar15 & 1);
        fVar246 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar110);
        bVar16 = fVar230 != fVar246;
        iVar283 = auVar116._0_4_;
        auVar96._16_48_ = auVar108._16_48_;
        auVar96._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar95._4_60_ = auVar96._4_60_;
        auVar95._0_4_ = (uint)bVar16 * iVar283 + (uint)!bVar16 * 0x7f800000;
        auVar53 = auVar95._0_16_;
        auVar98._16_48_ = auVar108._16_48_;
        auVar98._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar97._4_60_ = auVar98._4_60_;
        auVar97._0_4_ = (uint)bVar16 * iVar283 + (uint)!bVar16 * -0x800000;
        auVar61 = auVar97._0_16_;
        uVar15 = vcmpss_avx512f(auVar59,auVar42,1);
        bVar16 = (bool)((byte)uVar15 & 1);
        fVar241 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar110);
        if ((fVar230 != fVar241) || (NAN(fVar230) || NAN(fVar241))) {
          fVar242 = auVar59._0_4_;
          fVar230 = auVar54._0_4_;
          bVar16 = fVar242 == fVar230;
          if ((!bVar16) || (NAN(fVar242) || NAN(fVar230))) {
            auVar20._8_4_ = 0x80000000;
            auVar20._0_8_ = 0x8000000080000000;
            auVar20._12_4_ = 0x80000000;
            auVar54 = vxorps_avx512vl(auVar54,auVar20);
            auVar270._0_4_ = auVar54._0_4_ / (fVar242 - fVar230);
            auVar270._4_12_ = auVar54._4_12_;
            auVar54 = vsubss_avx512f(auVar45,auVar270);
            auVar59 = vfmadd213ss_avx512f(auVar54,auVar42,auVar270);
            auVar54 = auVar59;
          }
          else {
            vucomiss_avx512f(auVar42);
            auVar100._16_48_ = auVar108._16_48_;
            auVar100._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar99._4_60_ = auVar100._4_60_;
            auVar99._0_4_ = (uint)bVar16 * iVar283 + (uint)!bVar16 * 0x7f800000;
            auVar59 = auVar99._0_16_;
            auVar54 = ZEXT416((uint)bVar16 * 0x3f800000 + (uint)!bVar16 * -0x800000);
          }
          auVar53 = vminss_avx(auVar53,auVar59);
          auVar61 = vmaxss_avx(auVar54,auVar61);
        }
        uVar15 = vcmpss_avx512f(auVar48,auVar42,1);
        bVar16 = (bool)((byte)uVar15 & 1);
        fVar230 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar110);
        if ((fVar246 != fVar230) || (NAN(fVar246) || NAN(fVar230))) {
          fVar242 = auVar48._0_4_;
          fVar246 = auVar43._0_4_;
          bVar16 = fVar242 == fVar246;
          if ((!bVar16) || (NAN(fVar242) || NAN(fVar246))) {
            auVar19._8_4_ = 0x80000000;
            auVar19._0_8_ = 0x8000000080000000;
            auVar19._12_4_ = 0x80000000;
            auVar43 = vxorps_avx512vl(auVar43,auVar19);
            auVar233._0_4_ = auVar43._0_4_ / (fVar242 - fVar246);
            auVar233._4_12_ = auVar43._4_12_;
            auVar43 = vsubss_avx512f(auVar45,auVar233);
            auVar48 = vfmadd213ss_avx512f(auVar43,auVar42,auVar233);
            auVar43 = auVar48;
          }
          else {
            vucomiss_avx512f(auVar42);
            auVar102._16_48_ = auVar108._16_48_;
            auVar102._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar101._4_60_ = auVar102._4_60_;
            auVar101._0_4_ = (uint)bVar16 * iVar283 + (uint)!bVar16 * 0x7f800000;
            auVar48 = auVar101._0_16_;
            auVar43 = ZEXT416((uint)bVar16 * 0x3f800000 + (uint)!bVar16 * -0x800000);
          }
          auVar53 = vminss_avx(auVar53,auVar48);
          auVar61 = vmaxss_avx(auVar43,auVar61);
        }
        bVar16 = fVar241 != fVar230;
        auVar43 = vminss_avx512f(auVar53,auVar45);
        auVar104._16_48_ = auVar108._16_48_;
        auVar104._0_16_ = auVar53;
        auVar103._4_60_ = auVar104._4_60_;
        auVar103._0_4_ = (uint)bVar16 * auVar43._0_4_ + (uint)!bVar16 * auVar53._0_4_;
        auVar43 = vmaxss_avx512f(auVar45,auVar61);
        auVar106._16_48_ = auVar108._16_48_;
        auVar106._0_16_ = auVar61;
        auVar105._4_60_ = auVar106._4_60_;
        auVar105._0_4_ = (uint)bVar16 * auVar43._0_4_ + (uint)!bVar16 * auVar61._0_4_;
        auVar61 = vmaxss_avx512f(auVar42,auVar103._0_16_);
        auVar43 = vminss_avx512f(auVar105._0_16_,auVar45);
        bVar16 = true;
        if (auVar43._0_4_ < auVar61._0_4_) {
          auVar282 = ZEXT1664(auVar281);
          auVar109._16_48_ = auVar108._16_48_;
          auVar108 = auVar109;
        }
        else {
          auVar49 = vmaxss_avx512f(auVar42,ZEXT416((uint)(auVar61._0_4_ + -0.1)));
          auVar68 = vminss_avx512f(ZEXT416((uint)(auVar43._0_4_ + 0.1)),auVar45);
          auVar124._0_8_ = auVar46._0_8_;
          auVar124._8_8_ = auVar124._0_8_;
          auVar224._8_8_ = auVar174._0_8_;
          auVar224._0_8_ = auVar174._0_8_;
          auVar234._8_8_ = auVar69._0_8_;
          auVar234._0_8_ = auVar69._0_8_;
          auVar61 = vshufpd_avx(auVar174,auVar174,3);
          auVar43 = vshufpd_avx(auVar69,auVar69,3);
          auVar48 = vshufps_avx(auVar49,auVar68,0);
          auVar60 = vsubps_avx512vl(auVar57,auVar48);
          fVar230 = auVar48._0_4_;
          auVar265._0_4_ = fVar230 * auVar67._0_4_;
          fVar246 = auVar48._4_4_;
          auVar265._4_4_ = fVar246 * auVar67._4_4_;
          fVar241 = auVar48._8_4_;
          auVar265._8_4_ = fVar241 * auVar67._8_4_;
          fVar242 = auVar48._12_4_;
          auVar265._12_4_ = fVar242 * auVar67._12_4_;
          auVar175._0_4_ = fVar230 * auVar61._0_4_;
          auVar175._4_4_ = fVar246 * auVar61._4_4_;
          auVar175._8_4_ = fVar241 * auVar61._8_4_;
          auVar175._12_4_ = fVar242 * auVar61._12_4_;
          auVar183._0_4_ = fVar230 * auVar43._0_4_;
          auVar183._4_4_ = fVar246 * auVar43._4_4_;
          auVar183._8_4_ = fVar241 * auVar43._8_4_;
          auVar183._12_4_ = fVar242 * auVar43._12_4_;
          auVar152._0_4_ = fVar230 * auVar47._0_4_;
          auVar152._4_4_ = fVar246 * auVar47._4_4_;
          auVar152._8_4_ = fVar241 * auVar47._8_4_;
          auVar152._12_4_ = fVar242 * auVar47._12_4_;
          auVar53 = vfmadd231ps_fma(auVar265,auVar60,auVar124);
          auVar54 = vfmadd231ps_fma(auVar175,auVar60,auVar224);
          auVar59 = vfmadd231ps_fma(auVar183,auVar60,auVar234);
          auVar60 = vfmadd231ps_fma(auVar152,auVar60,ZEXT816(0));
          auVar61 = vsubss_avx512f(auVar45,auVar49);
          auVar43 = vmovshdup_avx512vl(auVar281);
          auVar69 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar43._0_4_ * auVar49._0_4_)),auVar281,
                                        auVar61);
          auVar61 = vsubss_avx512f(auVar45,auVar68);
          auVar44 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar68._0_4_ * auVar43._0_4_)),auVar281,
                                        auVar61);
          auVar67 = vdivss_avx512f(auVar45,auVar63);
          auVar61 = vsubps_avx(auVar54,auVar53);
          auVar132._0_4_ = auVar61._0_4_ * 3.0;
          auVar132._4_4_ = auVar61._4_4_ * 3.0;
          auVar132._8_4_ = auVar61._8_4_ * 3.0;
          auVar132._12_4_ = auVar61._12_4_ * 3.0;
          auVar61 = vsubps_avx(auVar59,auVar54);
          auVar193._0_4_ = auVar61._0_4_ * 3.0;
          auVar193._4_4_ = auVar61._4_4_ * 3.0;
          auVar193._8_4_ = auVar61._8_4_ * 3.0;
          auVar193._12_4_ = auVar61._12_4_ * 3.0;
          auVar61 = vsubps_avx(auVar60,auVar59);
          auVar211._0_4_ = auVar61._0_4_ * 3.0;
          auVar211._4_4_ = auVar61._4_4_ * 3.0;
          auVar211._8_4_ = auVar61._8_4_ * 3.0;
          auVar211._12_4_ = auVar61._12_4_ * 3.0;
          auVar63 = vminps_avx(auVar193,auVar211);
          auVar61 = vmaxps_avx(auVar193,auVar211);
          auVar63 = vminps_avx(auVar132,auVar63);
          auVar61 = vmaxps_avx(auVar132,auVar61);
          auVar43 = vshufpd_avx(auVar63,auVar63,3);
          auVar48 = vshufpd_avx(auVar61,auVar61,3);
          auVar63 = vminps_avx(auVar63,auVar43);
          auVar61 = vmaxps_avx(auVar61,auVar48);
          fVar230 = auVar67._0_4_;
          auVar212._0_4_ = fVar230 * auVar63._0_4_;
          auVar212._4_4_ = fVar230 * auVar63._4_4_;
          auVar212._8_4_ = fVar230 * auVar63._8_4_;
          auVar212._12_4_ = fVar230 * auVar63._12_4_;
          auVar194._0_4_ = fVar230 * auVar61._0_4_;
          auVar194._4_4_ = fVar230 * auVar61._4_4_;
          auVar194._8_4_ = fVar230 * auVar61._8_4_;
          auVar194._12_4_ = fVar230 * auVar61._12_4_;
          auVar67 = vdivss_avx512f(auVar45,ZEXT416((uint)(auVar44._0_4_ - auVar69._0_4_)));
          auVar61 = vshufpd_avx(auVar53,auVar53,3);
          auVar63 = vshufpd_avx(auVar54,auVar54,3);
          auVar43 = vshufpd_avx(auVar59,auVar59,3);
          auVar48 = vshufpd_avx(auVar60,auVar60,3);
          auVar61 = vsubps_avx(auVar61,auVar53);
          auVar53 = vsubps_avx(auVar63,auVar54);
          auVar54 = vsubps_avx(auVar43,auVar59);
          auVar48 = vsubps_avx(auVar48,auVar60);
          auVar63 = vminps_avx(auVar61,auVar53);
          auVar61 = vmaxps_avx(auVar61,auVar53);
          auVar43 = vminps_avx(auVar54,auVar48);
          auVar43 = vminps_avx(auVar63,auVar43);
          auVar63 = vmaxps_avx(auVar54,auVar48);
          auVar61 = vmaxps_avx(auVar61,auVar63);
          fVar230 = auVar67._0_4_;
          auVar235._0_4_ = fVar230 * auVar43._0_4_;
          auVar235._4_4_ = fVar230 * auVar43._4_4_;
          auVar235._8_4_ = fVar230 * auVar43._8_4_;
          auVar235._12_4_ = fVar230 * auVar43._12_4_;
          auVar248._0_4_ = fVar230 * auVar61._0_4_;
          auVar248._4_4_ = fVar230 * auVar61._4_4_;
          auVar248._8_4_ = fVar230 * auVar61._8_4_;
          auVar248._12_4_ = fVar230 * auVar61._12_4_;
          auVar14 = vinsertps_avx512f(auVar109._0_16_,auVar69,0x10);
          auVar53 = vinsertps_avx(auVar62,auVar44,0x10);
          auVar115._0_4_ = auVar14._0_4_ + auVar53._0_4_;
          auVar115._4_4_ = auVar14._4_4_ + auVar53._4_4_;
          auVar115._8_4_ = auVar14._8_4_ + auVar53._8_4_;
          auVar115._12_4_ = auVar14._12_4_ + auVar53._12_4_;
          auVar49 = vmulps_avx512vl(auVar115,auVar288._0_16_);
          auVar43 = vshufps_avx(auVar49,auVar49,0x54);
          uVar112 = auVar49._0_4_;
          auVar133._4_4_ = uVar112;
          auVar133._0_4_ = uVar112;
          auVar133._8_4_ = uVar112;
          auVar133._12_4_ = uVar112;
          auVar48 = vfmadd213ps_avx512vl(auVar93._0_16_,auVar133,auVar56);
          auVar54 = vfmadd213ps_avx512vl(local_470,auVar133,auVar51);
          auVar63 = vfmadd213ps_fma(local_480,auVar133,auVar50);
          auVar61 = vsubps_avx(auVar54,auVar48);
          auVar48 = vfmadd213ps_fma(auVar61,auVar133,auVar48);
          auVar61 = vsubps_avx(auVar63,auVar54);
          auVar61 = vfmadd213ps_fma(auVar61,auVar133,auVar54);
          auVar61 = vsubps_avx(auVar61,auVar48);
          auVar63 = vfmadd231ps_fma(auVar48,auVar61,auVar133);
          auVar134._0_8_ = CONCAT44(auVar61._4_4_ * 3.0,auVar61._0_4_ * 3.0);
          auVar134._8_4_ = auVar61._8_4_ * 3.0;
          auVar134._12_4_ = auVar61._12_4_ * 3.0;
          auVar257._8_8_ = auVar63._0_8_;
          auVar257._0_8_ = auVar63._0_8_;
          auVar61 = vshufpd_avx(auVar63,auVar63,3);
          auVar63 = vshufps_avx(auVar49,auVar49,0x55);
          auVar48 = vsubps_avx(auVar61,auVar257);
          auVar54 = vfmadd231ps_fma(auVar257,auVar63,auVar48);
          auVar271._8_8_ = auVar134._0_8_;
          auVar271._0_8_ = auVar134._0_8_;
          auVar61 = vshufpd_avx(auVar134,auVar134,3);
          auVar61 = vsubps_avx(auVar61,auVar271);
          auVar63 = vfmadd213ps_fma(auVar61,auVar63,auVar271);
          auVar135._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
          auVar135._8_4_ = auVar48._8_4_ ^ 0x80000000;
          auVar135._12_4_ = auVar48._12_4_ ^ 0x80000000;
          auVar61 = vmovshdup_avx(auVar63);
          auVar272._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
          auVar272._8_4_ = auVar61._8_4_ ^ 0x80000000;
          auVar272._12_4_ = auVar61._12_4_ ^ 0x80000000;
          auVar59 = vmovshdup_avx512vl(auVar48);
          auVar60 = vpermt2ps_avx512vl(auVar272,ZEXT416(5),auVar48);
          auVar61 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar61._0_4_ * auVar48._0_4_)),auVar63,
                                        auVar59);
          auVar63 = vpermt2ps_avx512vl(auVar63,SUB6416(ZEXT464(4),0),auVar135);
          auVar153._0_4_ = auVar61._0_4_;
          auVar153._4_4_ = auVar153._0_4_;
          auVar153._8_4_ = auVar153._0_4_;
          auVar153._12_4_ = auVar153._0_4_;
          auVar61 = vdivps_avx(auVar60,auVar153);
          auVar63 = vdivps_avx(auVar63,auVar153);
          fVar246 = auVar54._0_4_;
          auVar48 = vshufps_avx(auVar54,auVar54,0x55);
          fVar230 = auVar63._0_4_;
          auVar258._0_4_ = fVar246 * auVar61._0_4_ + auVar48._0_4_ * fVar230;
          auVar258._4_4_ = fVar246 * auVar61._4_4_ + auVar48._4_4_ * auVar63._4_4_;
          auVar258._8_4_ = fVar246 * auVar61._8_4_ + auVar48._8_4_ * auVar63._8_4_;
          auVar258._12_4_ = fVar246 * auVar61._12_4_ + auVar48._12_4_ * auVar63._12_4_;
          auVar68 = vsubps_avx(auVar43,auVar258);
          auVar54 = vmovshdup_avx(auVar61);
          auVar43 = vinsertps_avx(auVar212,auVar235,0x1c);
          auVar273._0_4_ = auVar54._0_4_ * auVar43._0_4_;
          auVar273._4_4_ = auVar54._4_4_ * auVar43._4_4_;
          auVar273._8_4_ = auVar54._8_4_ * auVar43._8_4_;
          auVar273._12_4_ = auVar54._12_4_ * auVar43._12_4_;
          auVar48 = vinsertps_avx(auVar194,auVar248,0x1c);
          auVar259._0_4_ = auVar54._0_4_ * auVar48._0_4_;
          auVar259._4_4_ = auVar54._4_4_ * auVar48._4_4_;
          auVar259._8_4_ = auVar54._8_4_ * auVar48._8_4_;
          auVar259._12_4_ = auVar54._12_4_ * auVar48._12_4_;
          auVar47 = vminps_avx512vl(auVar273,auVar259);
          auVar60 = vmaxps_avx(auVar259,auVar273);
          auVar67 = vmovshdup_avx(auVar63);
          auVar54 = vinsertps_avx(auVar235,auVar212,0x4c);
          auVar236._0_4_ = auVar67._0_4_ * auVar54._0_4_;
          auVar236._4_4_ = auVar67._4_4_ * auVar54._4_4_;
          auVar236._8_4_ = auVar67._8_4_ * auVar54._8_4_;
          auVar236._12_4_ = auVar67._12_4_ * auVar54._12_4_;
          auVar59 = vinsertps_avx(auVar248,auVar194,0x4c);
          auVar249._0_4_ = auVar67._0_4_ * auVar59._0_4_;
          auVar249._4_4_ = auVar67._4_4_ * auVar59._4_4_;
          auVar249._8_4_ = auVar67._8_4_ * auVar59._8_4_;
          auVar249._12_4_ = auVar67._12_4_ * auVar59._12_4_;
          auVar67 = vminps_avx(auVar236,auVar249);
          auVar47 = vaddps_avx512vl(auVar47,auVar67);
          auVar67 = vmaxps_avx(auVar249,auVar236);
          auVar237._0_4_ = auVar60._0_4_ + auVar67._0_4_;
          auVar237._4_4_ = auVar60._4_4_ + auVar67._4_4_;
          auVar237._8_4_ = auVar60._8_4_ + auVar67._8_4_;
          auVar237._12_4_ = auVar60._12_4_ + auVar67._12_4_;
          auVar250._8_8_ = 0x3f80000000000000;
          auVar250._0_8_ = 0x3f80000000000000;
          auVar60 = vsubps_avx(auVar250,auVar237);
          auVar67 = vsubps_avx(auVar250,auVar47);
          auVar47 = vsubps_avx(auVar14,auVar49);
          auVar49 = vsubps_avx(auVar53,auVar49);
          fVar244 = auVar47._0_4_;
          auVar274._0_4_ = fVar244 * auVar60._0_4_;
          fVar245 = auVar47._4_4_;
          auVar274._4_4_ = fVar245 * auVar60._4_4_;
          fVar189 = auVar47._8_4_;
          auVar274._8_4_ = fVar189 * auVar60._8_4_;
          fVar203 = auVar47._12_4_;
          auVar274._12_4_ = fVar203 * auVar60._12_4_;
          auVar46 = vbroadcastss_avx512vl(auVar61);
          auVar43 = vmulps_avx512vl(auVar46,auVar43);
          auVar48 = vmulps_avx512vl(auVar46,auVar48);
          auVar46 = vminps_avx512vl(auVar43,auVar48);
          auVar43 = vmaxps_avx(auVar48,auVar43);
          auVar213._0_4_ = fVar230 * auVar54._0_4_;
          auVar213._4_4_ = fVar230 * auVar54._4_4_;
          auVar213._8_4_ = fVar230 * auVar54._8_4_;
          auVar213._12_4_ = fVar230 * auVar54._12_4_;
          auVar195._0_4_ = fVar230 * auVar59._0_4_;
          auVar195._4_4_ = fVar230 * auVar59._4_4_;
          auVar195._8_4_ = fVar230 * auVar59._8_4_;
          auVar195._12_4_ = fVar230 * auVar59._12_4_;
          auVar48 = vminps_avx(auVar213,auVar195);
          auVar54 = vaddps_avx512vl(auVar46,auVar48);
          auVar59 = vmulps_avx512vl(auVar47,auVar67);
          fVar246 = auVar49._0_4_;
          auVar238._0_4_ = fVar246 * auVar60._0_4_;
          fVar241 = auVar49._4_4_;
          auVar238._4_4_ = fVar241 * auVar60._4_4_;
          fVar242 = auVar49._8_4_;
          auVar238._8_4_ = fVar242 * auVar60._8_4_;
          fVar243 = auVar49._12_4_;
          auVar238._12_4_ = fVar243 * auVar60._12_4_;
          auVar251._0_4_ = fVar246 * auVar67._0_4_;
          auVar251._4_4_ = fVar241 * auVar67._4_4_;
          auVar251._8_4_ = fVar242 * auVar67._8_4_;
          auVar251._12_4_ = fVar243 * auVar67._12_4_;
          auVar48 = vmaxps_avx(auVar195,auVar213);
          auVar196._0_4_ = auVar43._0_4_ + auVar48._0_4_;
          auVar196._4_4_ = auVar43._4_4_ + auVar48._4_4_;
          auVar196._8_4_ = auVar43._8_4_ + auVar48._8_4_;
          auVar196._12_4_ = auVar43._12_4_ + auVar48._12_4_;
          auVar214._8_8_ = 0x3f800000;
          auVar214._0_8_ = 0x3f800000;
          auVar43 = vsubps_avx(auVar214,auVar196);
          auVar48 = vsubps_avx(auVar214,auVar54);
          auVar266._0_4_ = fVar244 * auVar43._0_4_;
          auVar266._4_4_ = fVar245 * auVar43._4_4_;
          auVar266._8_4_ = fVar189 * auVar43._8_4_;
          auVar266._12_4_ = fVar203 * auVar43._12_4_;
          auVar260._0_4_ = fVar244 * auVar48._0_4_;
          auVar260._4_4_ = fVar245 * auVar48._4_4_;
          auVar260._8_4_ = fVar189 * auVar48._8_4_;
          auVar260._12_4_ = fVar203 * auVar48._12_4_;
          auVar197._0_4_ = fVar246 * auVar43._0_4_;
          auVar197._4_4_ = fVar241 * auVar43._4_4_;
          auVar197._8_4_ = fVar242 * auVar43._8_4_;
          auVar197._12_4_ = fVar243 * auVar43._12_4_;
          auVar215._0_4_ = fVar246 * auVar48._0_4_;
          auVar215._4_4_ = fVar241 * auVar48._4_4_;
          auVar215._8_4_ = fVar242 * auVar48._8_4_;
          auVar215._12_4_ = fVar243 * auVar48._12_4_;
          auVar43 = vminps_avx(auVar266,auVar260);
          auVar48 = vminps_avx(auVar197,auVar215);
          auVar54 = vminps_avx(auVar43,auVar48);
          auVar43 = vmaxps_avx(auVar260,auVar266);
          auVar48 = vmaxps_avx(auVar215,auVar197);
          auVar48 = vmaxps_avx(auVar48,auVar43);
          auVar60 = vminps_avx512vl(auVar274,auVar59);
          auVar43 = vminps_avx(auVar238,auVar251);
          auVar43 = vminps_avx(auVar60,auVar43);
          auVar43 = vhaddps_avx(auVar54,auVar43);
          auVar59 = vmaxps_avx512vl(auVar59,auVar274);
          auVar54 = vmaxps_avx(auVar251,auVar238);
          auVar54 = vmaxps_avx(auVar54,auVar59);
          auVar48 = vhaddps_avx(auVar48,auVar54);
          auVar43 = vshufps_avx(auVar43,auVar43,0xe8);
          auVar48 = vshufps_avx(auVar48,auVar48,0xe8);
          auVar198._0_4_ = auVar43._0_4_ + auVar68._0_4_;
          auVar198._4_4_ = auVar43._4_4_ + auVar68._4_4_;
          auVar198._8_4_ = auVar43._8_4_ + auVar68._8_4_;
          auVar198._12_4_ = auVar43._12_4_ + auVar68._12_4_;
          auVar216._0_4_ = auVar48._0_4_ + auVar68._0_4_;
          auVar216._4_4_ = auVar48._4_4_ + auVar68._4_4_;
          auVar216._8_4_ = auVar48._8_4_ + auVar68._8_4_;
          auVar216._12_4_ = auVar48._12_4_ + auVar68._12_4_;
          auVar43 = vmaxps_avx(auVar14,auVar198);
          auVar48 = vminps_avx(auVar216,auVar53);
          uVar3 = vcmpps_avx512vl(auVar48,auVar43,1);
          auVar43 = vinsertps_avx512f(auVar69,auVar44,0x10);
          auVar282 = ZEXT1664(auVar43);
          if ((uVar3 & 3) == 0) {
            vucomiss_avx512f(auVar109._0_16_);
            auVar108._0_16_ = auVar56;
            local_690 = auVar58._0_4_;
            fStack_68c = auVar58._4_4_;
            fStack_688 = auVar58._8_4_;
            fStack_684 = auVar58._12_4_;
            if (uVar37 < 4 && (uVar7 == 0 || lVar36 == 0)) {
              bVar16 = false;
            }
            else {
              lVar36 = 200;
              do {
                auVar48 = vsubss_avx512f(auVar45,auVar68);
                fVar242 = auVar48._0_4_;
                fVar246 = fVar242 * fVar242 * fVar242;
                fVar243 = auVar68._0_4_;
                fVar241 = fVar243 * 3.0 * fVar242 * fVar242;
                fVar242 = fVar242 * fVar243 * fVar243 * 3.0;
                auVar176._4_4_ = fVar246;
                auVar176._0_4_ = fVar246;
                auVar176._8_4_ = fVar246;
                auVar176._12_4_ = fVar246;
                auVar162._4_4_ = fVar241;
                auVar162._0_4_ = fVar241;
                auVar162._8_4_ = fVar241;
                auVar162._12_4_ = fVar241;
                auVar125._4_4_ = fVar242;
                auVar125._0_4_ = fVar242;
                auVar125._8_4_ = fVar242;
                auVar125._12_4_ = fVar242;
                fVar243 = fVar243 * fVar243 * fVar243;
                auVar184._0_4_ = local_690 * fVar243;
                auVar184._4_4_ = fStack_68c * fVar243;
                auVar184._8_4_ = fStack_688 * fVar243;
                auVar184._12_4_ = fStack_684 * fVar243;
                auVar48 = vfmadd231ps_fma(auVar184,auVar50,auVar125);
                auVar48 = vfmadd231ps_fma(auVar48,auVar51,auVar162);
                auVar48 = vfmadd231ps_avx512vl(auVar48,auVar56,auVar176);
                auVar126._8_8_ = auVar48._0_8_;
                auVar126._0_8_ = auVar48._0_8_;
                auVar48 = vshufpd_avx(auVar48,auVar48,3);
                auVar53 = vshufps_avx(auVar68,auVar68,0x55);
                auVar48 = vsubps_avx(auVar48,auVar126);
                auVar53 = vfmadd213ps_fma(auVar48,auVar53,auVar126);
                fVar246 = auVar53._0_4_;
                auVar48 = vshufps_avx(auVar53,auVar53,0x55);
                auVar127._0_4_ = auVar61._0_4_ * fVar246 + fVar230 * auVar48._0_4_;
                auVar127._4_4_ = auVar61._4_4_ * fVar246 + auVar63._4_4_ * auVar48._4_4_;
                auVar127._8_4_ = auVar61._8_4_ * fVar246 + auVar63._8_4_ * auVar48._8_4_;
                auVar127._12_4_ = auVar61._12_4_ * fVar246 + auVar63._12_4_ * auVar48._12_4_;
                auVar68 = vsubps_avx(auVar68,auVar127);
                auVar48 = vandps_avx512vl(auVar53,auVar287._0_16_);
                auVar108._0_16_ = vprolq_avx512vl(auVar48,0x20);
                auVar48 = vmaxss_avx(auVar108._0_16_,auVar48);
                bVar41 = auVar48._0_4_ <= fVar111;
                if (auVar48._0_4_ < fVar111) {
                  auVar61 = vucomiss_avx512f(auVar42);
                  if (bVar41) {
                    auVar63 = vucomiss_avx512f(auVar61);
                    auVar286 = ZEXT1664(auVar63);
                    if (bVar41) {
                      vmovshdup_avx(auVar61);
                      auVar63 = vucomiss_avx512f(auVar42);
                      if (bVar41) {
                        auVar45 = vucomiss_avx512f(auVar63);
                        auVar286 = ZEXT1664(auVar45);
                        if (bVar41) {
                          auVar48 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar49 = vinsertps_avx(auVar48,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar48 = vdpps_avx(auVar49,local_490,0x7f);
                          auVar53 = vdpps_avx(auVar49,local_4a0,0x7f);
                          auVar54 = vdpps_avx(auVar49,local_4b0,0x7f);
                          auVar59 = vdpps_avx(auVar49,local_4c0,0x7f);
                          auVar60 = vdpps_avx(auVar49,local_4d0,0x7f);
                          auVar67 = vdpps_avx(auVar49,local_4e0,0x7f);
                          auVar47 = vdpps_avx(auVar49,local_4f0,0x7f);
                          auVar49 = vdpps_avx(auVar49,local_500,0x7f);
                          auVar68 = vsubss_avx512f(auVar45,auVar63);
                          fVar230 = auVar63._0_4_;
                          auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar230 * auVar60._0_4_)),auVar68
                                                    ,auVar48);
                          auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * fVar230)),auVar68
                                                    ,auVar53);
                          auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * fVar230)),auVar68
                                                    ,auVar54);
                          auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar230 * auVar49._0_4_)),auVar68
                                                    ,auVar59);
                          auVar108._0_16_ = vsubss_avx512f(auVar45,auVar61);
                          auVar185._0_4_ = auVar108._0_4_;
                          fVar230 = auVar185._0_4_ * auVar185._0_4_ * auVar185._0_4_;
                          fVar242 = auVar61._0_4_;
                          fVar246 = fVar242 * 3.0 * auVar185._0_4_ * auVar185._0_4_;
                          fVar241 = auVar185._0_4_ * fVar242 * fVar242 * 3.0;
                          fVar244 = fVar242 * fVar242 * fVar242;
                          auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar244 * auVar54._0_4_)),
                                                    ZEXT416((uint)fVar241),auVar53);
                          auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar246),auVar48);
                          auVar63 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar230),auVar63);
                          fVar243 = auVar63._0_4_;
                          if ((fVar142 <= fVar243) &&
                             (fVar245 = *(float *)(ray + k * 4 + 0x200), fVar243 <= fVar245)) {
                            auVar63 = vshufps_avx(auVar61,auVar61,0x55);
                            auVar48 = vsubps_avx512vl(auVar57,auVar63);
                            fVar189 = auVar63._0_4_;
                            auVar225._0_4_ = fVar189 * (float)local_550._0_4_;
                            fVar203 = auVar63._4_4_;
                            auVar225._4_4_ = fVar203 * (float)local_550._4_4_;
                            fVar204 = auVar63._8_4_;
                            auVar225._8_4_ = fVar204 * fStack_548;
                            fVar205 = auVar63._12_4_;
                            auVar225._12_4_ = fVar205 * fStack_544;
                            auVar239._0_4_ = fVar189 * (float)local_560._0_4_;
                            auVar239._4_4_ = fVar203 * (float)local_560._4_4_;
                            auVar239._8_4_ = fVar204 * fStack_558;
                            auVar239._12_4_ = fVar205 * fStack_554;
                            auVar252._0_4_ = fVar189 * (float)local_570._0_4_;
                            auVar252._4_4_ = fVar203 * (float)local_570._4_4_;
                            auVar252._8_4_ = fVar204 * fStack_568;
                            auVar252._12_4_ = fVar205 * fStack_564;
                            auVar199._0_4_ = fVar189 * (float)local_580._0_4_;
                            auVar199._4_4_ = fVar203 * (float)local_580._4_4_;
                            auVar199._8_4_ = fVar204 * fStack_578;
                            auVar199._12_4_ = fVar205 * fStack_574;
                            auVar57 = vfmadd231ps_fma(auVar225,auVar48,local_510);
                            auVar63 = vfmadd231ps_fma(auVar239,auVar48,local_520);
                            auVar45 = vfmadd231ps_fma(auVar252,auVar48,local_530);
                            auVar48 = vfmadd231ps_fma(auVar199,auVar48,local_540);
                            auVar57 = vsubps_avx(auVar63,auVar57);
                            auVar63 = vsubps_avx(auVar45,auVar63);
                            auVar45 = vsubps_avx(auVar48,auVar45);
                            auVar253._0_4_ = fVar242 * auVar63._0_4_;
                            auVar253._4_4_ = fVar242 * auVar63._4_4_;
                            auVar253._8_4_ = fVar242 * auVar63._8_4_;
                            auVar253._12_4_ = fVar242 * auVar63._12_4_;
                            auVar185._4_4_ = auVar185._0_4_;
                            auVar185._8_4_ = auVar185._0_4_;
                            auVar185._12_4_ = auVar185._0_4_;
                            auVar57 = vfmadd231ps_fma(auVar253,auVar185,auVar57);
                            auVar200._0_4_ = fVar242 * auVar45._0_4_;
                            auVar200._4_4_ = fVar242 * auVar45._4_4_;
                            auVar200._8_4_ = fVar242 * auVar45._8_4_;
                            auVar200._12_4_ = fVar242 * auVar45._12_4_;
                            auVar63 = vfmadd231ps_fma(auVar200,auVar185,auVar63);
                            auVar201._0_4_ = fVar242 * auVar63._0_4_;
                            auVar201._4_4_ = fVar242 * auVar63._4_4_;
                            auVar201._8_4_ = fVar242 * auVar63._8_4_;
                            auVar201._12_4_ = fVar242 * auVar63._12_4_;
                            auVar57 = vfmadd231ps_fma(auVar201,auVar185,auVar57);
                            auVar18._8_4_ = 0x40400000;
                            auVar18._0_8_ = 0x4040000040400000;
                            auVar18._12_4_ = 0x40400000;
                            auVar108._0_16_ = vmulps_avx512vl(auVar57,auVar18);
                            pGVar8 = (context->scene->geometries).items[uVar39].ptr;
                            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                              bVar41 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar41 = true,
                                    pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar177._0_4_ = fVar244 * (float)local_5c0._0_4_;
                              auVar177._4_4_ = fVar244 * (float)local_5c0._4_4_;
                              auVar177._8_4_ = fVar244 * fStack_5b8;
                              auVar177._12_4_ = fVar244 * fStack_5b4;
                              auVar163._4_4_ = fVar241;
                              auVar163._0_4_ = fVar241;
                              auVar163._8_4_ = fVar241;
                              auVar163._12_4_ = fVar241;
                              auVar57 = vfmadd132ps_fma(auVar163,auVar177,local_5b0);
                              auVar154._4_4_ = fVar246;
                              auVar154._0_4_ = fVar246;
                              auVar154._8_4_ = fVar246;
                              auVar154._12_4_ = fVar246;
                              auVar57 = vfmadd132ps_fma(auVar154,auVar57,local_5a0);
                              auVar136._4_4_ = fVar230;
                              auVar136._0_4_ = fVar230;
                              auVar136._8_4_ = fVar230;
                              auVar136._12_4_ = fVar230;
                              auVar45 = vfmadd132ps_fma(auVar136,auVar57,local_590);
                              auVar57 = vshufps_avx(auVar45,auVar45,0xc9);
                              auVar63 = vshufps_avx(auVar108._0_16_,auVar108._0_16_,0xc9);
                              auVar137._0_4_ = auVar45._0_4_ * auVar63._0_4_;
                              auVar137._4_4_ = auVar45._4_4_ * auVar63._4_4_;
                              auVar137._8_4_ = auVar45._8_4_ * auVar63._8_4_;
                              auVar137._12_4_ = auVar45._12_4_ * auVar63._12_4_;
                              auVar57 = vfmsub231ps_fma(auVar137,auVar108._0_16_,auVar57);
                              local_200 = vbroadcastss_avx512f(auVar61);
                              auVar282 = vbroadcastss_avx512f(ZEXT416(1));
                              local_1c0 = vpermps_avx512f(auVar282,ZEXT1664(auVar61));
                              auVar282 = vpermps_avx512f(auVar282,ZEXT1664(auVar57));
                              auVar107 = vbroadcastss_avx512f(ZEXT416(2));
                              local_280 = vpermps_avx512f(auVar107,ZEXT1664(auVar57));
                              local_240 = vbroadcastss_avx512f(auVar57);
                              local_2c0[0] = (RTCHitN)auVar282[0];
                              local_2c0[1] = (RTCHitN)auVar282[1];
                              local_2c0[2] = (RTCHitN)auVar282[2];
                              local_2c0[3] = (RTCHitN)auVar282[3];
                              local_2c0[4] = (RTCHitN)auVar282[4];
                              local_2c0[5] = (RTCHitN)auVar282[5];
                              local_2c0[6] = (RTCHitN)auVar282[6];
                              local_2c0[7] = (RTCHitN)auVar282[7];
                              local_2c0[8] = (RTCHitN)auVar282[8];
                              local_2c0[9] = (RTCHitN)auVar282[9];
                              local_2c0[10] = (RTCHitN)auVar282[10];
                              local_2c0[0xb] = (RTCHitN)auVar282[0xb];
                              local_2c0[0xc] = (RTCHitN)auVar282[0xc];
                              local_2c0[0xd] = (RTCHitN)auVar282[0xd];
                              local_2c0[0xe] = (RTCHitN)auVar282[0xe];
                              local_2c0[0xf] = (RTCHitN)auVar282[0xf];
                              local_2c0[0x10] = (RTCHitN)auVar282[0x10];
                              local_2c0[0x11] = (RTCHitN)auVar282[0x11];
                              local_2c0[0x12] = (RTCHitN)auVar282[0x12];
                              local_2c0[0x13] = (RTCHitN)auVar282[0x13];
                              local_2c0[0x14] = (RTCHitN)auVar282[0x14];
                              local_2c0[0x15] = (RTCHitN)auVar282[0x15];
                              local_2c0[0x16] = (RTCHitN)auVar282[0x16];
                              local_2c0[0x17] = (RTCHitN)auVar282[0x17];
                              local_2c0[0x18] = (RTCHitN)auVar282[0x18];
                              local_2c0[0x19] = (RTCHitN)auVar282[0x19];
                              local_2c0[0x1a] = (RTCHitN)auVar282[0x1a];
                              local_2c0[0x1b] = (RTCHitN)auVar282[0x1b];
                              local_2c0[0x1c] = (RTCHitN)auVar282[0x1c];
                              local_2c0[0x1d] = (RTCHitN)auVar282[0x1d];
                              local_2c0[0x1e] = (RTCHitN)auVar282[0x1e];
                              local_2c0[0x1f] = (RTCHitN)auVar282[0x1f];
                              local_2c0[0x20] = (RTCHitN)auVar282[0x20];
                              local_2c0[0x21] = (RTCHitN)auVar282[0x21];
                              local_2c0[0x22] = (RTCHitN)auVar282[0x22];
                              local_2c0[0x23] = (RTCHitN)auVar282[0x23];
                              local_2c0[0x24] = (RTCHitN)auVar282[0x24];
                              local_2c0[0x25] = (RTCHitN)auVar282[0x25];
                              local_2c0[0x26] = (RTCHitN)auVar282[0x26];
                              local_2c0[0x27] = (RTCHitN)auVar282[0x27];
                              local_2c0[0x28] = (RTCHitN)auVar282[0x28];
                              local_2c0[0x29] = (RTCHitN)auVar282[0x29];
                              local_2c0[0x2a] = (RTCHitN)auVar282[0x2a];
                              local_2c0[0x2b] = (RTCHitN)auVar282[0x2b];
                              local_2c0[0x2c] = (RTCHitN)auVar282[0x2c];
                              local_2c0[0x2d] = (RTCHitN)auVar282[0x2d];
                              local_2c0[0x2e] = (RTCHitN)auVar282[0x2e];
                              local_2c0[0x2f] = (RTCHitN)auVar282[0x2f];
                              local_2c0[0x30] = (RTCHitN)auVar282[0x30];
                              local_2c0[0x31] = (RTCHitN)auVar282[0x31];
                              local_2c0[0x32] = (RTCHitN)auVar282[0x32];
                              local_2c0[0x33] = (RTCHitN)auVar282[0x33];
                              local_2c0[0x34] = (RTCHitN)auVar282[0x34];
                              local_2c0[0x35] = (RTCHitN)auVar282[0x35];
                              local_2c0[0x36] = (RTCHitN)auVar282[0x36];
                              local_2c0[0x37] = (RTCHitN)auVar282[0x37];
                              local_2c0[0x38] = (RTCHitN)auVar282[0x38];
                              local_2c0[0x39] = (RTCHitN)auVar282[0x39];
                              local_2c0[0x3a] = (RTCHitN)auVar282[0x3a];
                              local_2c0[0x3b] = (RTCHitN)auVar282[0x3b];
                              local_2c0[0x3c] = (RTCHitN)auVar282[0x3c];
                              local_2c0[0x3d] = (RTCHitN)auVar282[0x3d];
                              local_2c0[0x3e] = (RTCHitN)auVar282[0x3e];
                              local_2c0[0x3f] = (RTCHitN)auVar282[0x3f];
                              local_180 = local_300._0_8_;
                              uStack_178 = local_300._8_8_;
                              uStack_170 = local_300._16_8_;
                              uStack_168 = local_300._24_8_;
                              uStack_160 = local_300._32_8_;
                              uStack_158 = local_300._40_8_;
                              uStack_150 = local_300._48_8_;
                              uStack_148 = local_300._56_8_;
                              auVar282 = vmovdqa64_avx512f(local_340);
                              local_140 = vmovdqa64_avx512f(auVar282);
                              vpcmpeqd_avx2(auVar282._0_32_,auVar282._0_32_);
                              local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                              local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]))
                              ;
                              *(float *)(ray + k * 4 + 0x200) = fVar243;
                              local_440 = local_380;
                              local_5f0.valid = (int *)local_440;
                              local_5f0.geometryUserPtr = pGVar8->userPtr;
                              local_5f0.context = context->user;
                              local_5f0.ray = (RTCRayN *)ray;
                              local_5f0.hit = local_2c0;
                              local_5f0.N = 0x10;
                              if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar8->occlusionFilterN)(&local_5f0);
                                auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar285 = ZEXT1664(auVar57);
                                in_ZMM21 = ZEXT464(0x3a83126f);
                                auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar284 = ZEXT3264(auVar74);
                                auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar287 = ZEXT1664(auVar57);
                                auVar286 = ZEXT464(0x3f800000);
                                auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                auVar288 = ZEXT1664(auVar57);
                                auVar42 = vxorps_avx512vl(auVar42,auVar42);
                                auVar116 = ZEXT1664(auVar42);
                              }
                              auVar42 = auVar116._0_16_;
                              auVar108 = vmovdqa64_avx512f(local_440);
                              uVar15 = vptestmd_avx512f(auVar108,auVar108);
                              if ((short)uVar15 == 0) {
                                bVar41 = false;
                              }
                              else {
                                p_Var13 = context->args->filter;
                                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var13)(&local_5f0);
                                  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar285 = ZEXT1664(auVar57);
                                  in_ZMM21 = ZEXT464(0x3a83126f);
                                  auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar284 = ZEXT3264(auVar74);
                                  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar287 = ZEXT1664(auVar57);
                                  auVar286 = ZEXT464(0x3f800000);
                                  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar288 = ZEXT1664(auVar57);
                                  auVar42 = vxorps_avx512vl(auVar42,auVar42);
                                  auVar116 = ZEXT1664(auVar42);
                                }
                                auVar282 = vmovdqa64_avx512f(local_440);
                                uVar3 = vptestmd_avx512f(auVar282,auVar282);
                                auVar282 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                bVar41 = (bool)((byte)uVar3 & 1);
                                auVar108._0_4_ =
                                     (uint)bVar41 * auVar282._0_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x200);
                                bVar41 = (bool)((byte)(uVar3 >> 1) & 1);
                                auVar108._4_4_ =
                                     (uint)bVar41 * auVar282._4_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x204);
                                bVar41 = (bool)((byte)(uVar3 >> 2) & 1);
                                auVar108._8_4_ =
                                     (uint)bVar41 * auVar282._8_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x208);
                                bVar41 = (bool)((byte)(uVar3 >> 3) & 1);
                                auVar108._12_4_ =
                                     (uint)bVar41 * auVar282._12_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x20c);
                                bVar41 = (bool)((byte)(uVar3 >> 4) & 1);
                                auVar108._16_4_ =
                                     (uint)bVar41 * auVar282._16_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x210);
                                bVar41 = (bool)((byte)(uVar3 >> 5) & 1);
                                auVar108._20_4_ =
                                     (uint)bVar41 * auVar282._20_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x214);
                                bVar41 = (bool)((byte)(uVar3 >> 6) & 1);
                                auVar108._24_4_ =
                                     (uint)bVar41 * auVar282._24_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x218);
                                bVar41 = (bool)((byte)(uVar3 >> 7) & 1);
                                auVar108._28_4_ =
                                     (uint)bVar41 * auVar282._28_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x21c);
                                bVar41 = (bool)((byte)(uVar3 >> 8) & 1);
                                auVar108._32_4_ =
                                     (uint)bVar41 * auVar282._32_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x220);
                                bVar41 = (bool)((byte)(uVar3 >> 9) & 1);
                                auVar108._36_4_ =
                                     (uint)bVar41 * auVar282._36_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x224);
                                bVar41 = (bool)((byte)(uVar3 >> 10) & 1);
                                auVar108._40_4_ =
                                     (uint)bVar41 * auVar282._40_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x228);
                                bVar41 = (bool)((byte)(uVar3 >> 0xb) & 1);
                                auVar108._44_4_ =
                                     (uint)bVar41 * auVar282._44_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x22c);
                                bVar41 = (bool)((byte)(uVar3 >> 0xc) & 1);
                                auVar108._48_4_ =
                                     (uint)bVar41 * auVar282._48_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x230);
                                bVar41 = (bool)((byte)(uVar3 >> 0xd) & 1);
                                auVar108._52_4_ =
                                     (uint)bVar41 * auVar282._52_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x234);
                                bVar41 = (bool)((byte)(uVar3 >> 0xe) & 1);
                                auVar108._56_4_ =
                                     (uint)bVar41 * auVar282._56_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x238);
                                bVar41 = SUB81(uVar3 >> 0xf,0);
                                auVar108._60_4_ =
                                     (uint)bVar41 * auVar282._60_4_ |
                                     (uint)!bVar41 * *(int *)(local_5f0.ray + 0x23c);
                                *(undefined1 (*) [64])(local_5f0.ray + 0x200) = auVar108;
                                bVar41 = (short)uVar3 != 0;
                              }
                              if (!bVar41) {
                                *(float *)(ray + k * 4 + 0x200) = fVar245;
                              }
                            }
                            auVar282 = ZEXT1664(auVar43);
                            bVar40 = (bool)(bVar40 | bVar41);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar36 = lVar36 + -1;
              } while (lVar36 != 0);
            }
          }
          else {
            auVar108._0_16_ = auVar56;
          }
        }
      }
      auVar94._32_32_ = auVar108._32_32_;
    } while (bVar16);
    auVar42 = vinsertps_avx512f(auVar109._0_16_,auVar62,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }